

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  byte bVar49;
  byte bVar50;
  uint uVar51;
  byte bVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  byte bVar56;
  byte bVar57;
  long lVar58;
  undefined1 uVar59;
  bool bVar60;
  undefined1 uVar61;
  bool bVar62;
  uint uVar115;
  uint uVar116;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar117;
  uint uVar118;
  uint uVar119;
  uint uVar120;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  uint uVar121;
  float fVar122;
  float fVar146;
  vint4 bi_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar147;
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  vint4 ai_2;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  vint4 bi;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [64];
  vint4 ai;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined4 uVar210;
  float fVar211;
  float fVar221;
  float fVar222;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar220 [32];
  vint4 ai_1;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [64];
  undefined1 auVar234 [28];
  float fVar236;
  undefined1 auVar235 [64];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  float fVar239;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_920 [16];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  ulong local_8c8;
  ulong local_8c0;
  uint local_8b4;
  uint local_8b0;
  undefined4 local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  Primitive *local_6e0;
  ulong local_6d8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  RTCHitN local_440 [16];
  undefined1 auStack_430 [16];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  uint local_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  uint auStack_160 [8];
  float local_140 [2];
  uint local_138 [66];
  
  PVar1 = prim[1];
  uVar55 = (ulong)(byte)PVar1;
  fVar211 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar70 = vsubps_avx(auVar70,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  auVar189._0_4_ = fVar211 * auVar70._0_4_;
  auVar189._4_4_ = fVar211 * auVar70._4_4_;
  auVar189._8_4_ = fVar211 * auVar70._8_4_;
  auVar189._12_4_ = fVar211 * auVar70._12_4_;
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 4 + 6)));
  auVar123._0_4_ = fVar211 * auVar68._0_4_;
  auVar123._4_4_ = fVar211 * auVar68._4_4_;
  auVar123._8_4_ = fVar211 * auVar68._8_4_;
  auVar123._12_4_ = fVar211 * auVar68._12_4_;
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 5 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 6 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xb + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar55 + 6)));
  uVar53 = (ulong)(uint)((int)(uVar55 * 9) * 2);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + uVar55 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  uVar54 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar240._4_4_ = auVar123._0_4_;
  auVar240._0_4_ = auVar123._0_4_;
  auVar240._8_4_ = auVar123._0_4_;
  auVar240._12_4_ = auVar123._0_4_;
  auVar75 = vshufps_avx(auVar123,auVar123,0x55);
  auVar74 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar211 = auVar74._0_4_;
  auVar198._0_4_ = fVar211 * auVar63._0_4_;
  fVar146 = auVar74._4_4_;
  auVar198._4_4_ = fVar146 * auVar63._4_4_;
  fVar221 = auVar74._8_4_;
  auVar198._8_4_ = fVar221 * auVar63._8_4_;
  fVar222 = auVar74._12_4_;
  auVar198._12_4_ = fVar222 * auVar63._12_4_;
  auVar148._0_4_ = auVar64._0_4_ * fVar211;
  auVar148._4_4_ = auVar64._4_4_ * fVar146;
  auVar148._8_4_ = auVar64._8_4_ * fVar221;
  auVar148._12_4_ = auVar64._12_4_ * fVar222;
  auVar124._0_4_ = auVar65._0_4_ * fVar211;
  auVar124._4_4_ = auVar65._4_4_ * fVar146;
  auVar124._8_4_ = auVar65._8_4_ * fVar221;
  auVar124._12_4_ = auVar65._12_4_ * fVar222;
  auVar74 = vfmadd231ps_fma(auVar198,auVar75,auVar68);
  auVar67 = vfmadd231ps_fma(auVar148,auVar75,auVar71);
  auVar75 = vfmadd231ps_fma(auVar124,auVar72,auVar75);
  auVar66 = vfmadd231ps_fma(auVar74,auVar240,auVar70);
  auVar67 = vfmadd231ps_fma(auVar67,auVar240,auVar69);
  auVar123 = vfmadd231ps_fma(auVar75,auVar73,auVar240);
  auVar241._4_4_ = auVar189._0_4_;
  auVar241._0_4_ = auVar189._0_4_;
  auVar241._8_4_ = auVar189._0_4_;
  auVar241._12_4_ = auVar189._0_4_;
  auVar75 = vshufps_avx(auVar189,auVar189,0x55);
  auVar74 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar63 = vmulps_avx512vl(auVar74,auVar63);
  auVar190._0_4_ = auVar74._0_4_ * auVar64._0_4_;
  auVar190._4_4_ = auVar74._4_4_ * auVar64._4_4_;
  auVar190._8_4_ = auVar74._8_4_ * auVar64._8_4_;
  auVar190._12_4_ = auVar74._12_4_ * auVar64._12_4_;
  auVar168._0_4_ = auVar74._0_4_ * auVar65._0_4_;
  auVar168._4_4_ = auVar74._4_4_ * auVar65._4_4_;
  auVar168._8_4_ = auVar74._8_4_ * auVar65._8_4_;
  auVar168._12_4_ = auVar74._12_4_ * auVar65._12_4_;
  auVar64 = vfmadd231ps_avx512vl(auVar63,auVar75,auVar68);
  auVar68 = vfmadd231ps_fma(auVar190,auVar75,auVar71);
  auVar63 = vfmadd231ps_fma(auVar168,auVar75,auVar72);
  auVar65 = vfmadd231ps_avx512vl(auVar64,auVar241,auVar70);
  auVar64 = vfmadd231ps_fma(auVar68,auVar241,auVar69);
  auVar72 = vfmadd231ps_fma(auVar63,auVar241,auVar73);
  auVar227._8_4_ = 0x7fffffff;
  auVar227._0_8_ = 0x7fffffff7fffffff;
  auVar227._12_4_ = 0x7fffffff;
  auVar70 = vandps_avx(auVar66,auVar227);
  auVar212._8_4_ = 0x219392ef;
  auVar212._0_8_ = 0x219392ef219392ef;
  auVar212._12_4_ = 0x219392ef;
  uVar53 = vcmpps_avx512vl(auVar70,auVar212,1);
  bVar62 = (bool)((byte)uVar53 & 1);
  auVar74._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar66._0_4_;
  bVar62 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar66._4_4_;
  bVar62 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar66._8_4_;
  bVar62 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar66._12_4_;
  auVar70 = vandps_avx(auVar67,auVar227);
  uVar53 = vcmpps_avx512vl(auVar70,auVar212,1);
  bVar62 = (bool)((byte)uVar53 & 1);
  auVar66._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar67._0_4_;
  bVar62 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar67._4_4_;
  bVar62 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar67._8_4_;
  bVar62 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar67._12_4_;
  auVar70 = vandps_avx(auVar123,auVar227);
  uVar53 = vcmpps_avx512vl(auVar70,auVar212,1);
  bVar62 = (bool)((byte)uVar53 & 1);
  auVar67._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar123._0_4_;
  bVar62 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar123._4_4_;
  bVar62 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar123._8_4_;
  bVar62 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar123._12_4_;
  auVar68 = vrcp14ps_avx512vl(auVar74);
  auVar213._8_4_ = 0x3f800000;
  auVar213._0_8_ = &DAT_3f8000003f800000;
  auVar213._12_4_ = 0x3f800000;
  auVar70 = vfnmadd213ps_fma(auVar74,auVar68,auVar213);
  auVar63 = vfmadd132ps_fma(auVar70,auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar66);
  auVar70 = vfnmadd213ps_fma(auVar66,auVar68,auVar213);
  auVar71 = vfmadd132ps_fma(auVar70,auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar67);
  auVar70 = vfnmadd213ps_fma(auVar67,auVar68,auVar213);
  auVar73 = vfmadd132ps_fma(auVar70,auVar68,auVar68);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar55 * 7 + 6);
  auVar70 = vpmovsxwd_avx(auVar70);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vsubps_avx512vl(auVar70,auVar65);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar55 * 9 + 6);
  auVar70 = vpmovsxwd_avx(auVar68);
  auVar205._0_4_ = auVar63._0_4_ * auVar69._0_4_;
  auVar205._4_4_ = auVar63._4_4_ * auVar69._4_4_;
  auVar205._8_4_ = auVar63._8_4_ * auVar69._8_4_;
  auVar205._12_4_ = auVar63._12_4_ * auVar69._12_4_;
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx512vl(auVar70,auVar65);
  auVar199._0_4_ = auVar63._0_4_ * auVar70._0_4_;
  auVar199._4_4_ = auVar63._4_4_ * auVar70._4_4_;
  auVar199._8_4_ = auVar63._8_4_ * auVar70._8_4_;
  auVar199._12_4_ = auVar63._12_4_ * auVar70._12_4_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar68 = vpmovsxwd_avx(auVar63);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar55 * -2 + 6);
  auVar70 = vpmovsxwd_avx(auVar69);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar64);
  auVar228._0_4_ = auVar71._0_4_ * auVar70._0_4_;
  auVar228._4_4_ = auVar71._4_4_ * auVar70._4_4_;
  auVar228._8_4_ = auVar71._8_4_ * auVar70._8_4_;
  auVar228._12_4_ = auVar71._12_4_ * auVar70._12_4_;
  auVar70 = vcvtdq2ps_avx(auVar68);
  auVar70 = vsubps_avx(auVar70,auVar64);
  auVar149._0_4_ = auVar71._0_4_ * auVar70._0_4_;
  auVar149._4_4_ = auVar71._4_4_ * auVar70._4_4_;
  auVar149._8_4_ = auVar71._8_4_ * auVar70._8_4_;
  auVar149._12_4_ = auVar71._12_4_ * auVar70._12_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar54 + uVar55 + 6);
  auVar70 = vpmovsxwd_avx(auVar71);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar72);
  auVar191._0_4_ = auVar73._0_4_ * auVar70._0_4_;
  auVar191._4_4_ = auVar73._4_4_ * auVar70._4_4_;
  auVar191._8_4_ = auVar73._8_4_ * auVar70._8_4_;
  auVar191._12_4_ = auVar73._12_4_ * auVar70._12_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar55 * 0x17 + 6);
  auVar70 = vpmovsxwd_avx(auVar64);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar72);
  auVar125._0_4_ = auVar73._0_4_ * auVar70._0_4_;
  auVar125._4_4_ = auVar73._4_4_ * auVar70._4_4_;
  auVar125._8_4_ = auVar73._8_4_ * auVar70._8_4_;
  auVar125._12_4_ = auVar73._12_4_ * auVar70._12_4_;
  auVar70 = vpminsd_avx(auVar205,auVar199);
  auVar68 = vpminsd_avx(auVar228,auVar149);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar68 = vpminsd_avx(auVar191,auVar125);
  uVar210 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar73._4_4_ = uVar210;
  auVar73._0_4_ = uVar210;
  auVar73._8_4_ = uVar210;
  auVar73._12_4_ = uVar210;
  auVar68 = vmaxps_avx512vl(auVar68,auVar73);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  local_2b0 = vmulps_avx512vl(auVar70,auVar72);
  auVar70 = vpmaxsd_avx(auVar205,auVar199);
  auVar68 = vpmaxsd_avx(auVar228,auVar149);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar68 = vpmaxsd_avx(auVar191,auVar125);
  uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar65._4_4_ = uVar210;
  auVar65._0_4_ = uVar210;
  auVar65._8_4_ = uVar210;
  auVar65._12_4_ = uVar210;
  auVar68 = vminps_avx512vl(auVar68,auVar65);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar75._8_4_ = 0x3f800003;
  auVar75._0_8_ = 0x3f8000033f800003;
  auVar75._12_4_ = 0x3f800003;
  auVar70 = vmulps_avx512vl(auVar70,auVar75);
  auVar68 = vpbroadcastd_avx512vl();
  uVar12 = vcmpps_avx512vl(local_2b0,auVar70,2);
  local_6d8 = vpcmpgtd_avx512vl(auVar68,_DAT_01ff0cf0);
  local_6d8 = ((byte)uVar12 & 0xf) & local_6d8;
  bVar60 = (char)local_6d8 == '\0';
  bVar62 = !bVar60;
  if (bVar60) {
    return bVar62;
  }
  local_470 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6e0 = prim;
LAB_01b873ac:
  lVar58 = 0;
  for (uVar53 = local_6d8; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  local_8c8 = (ulong)*(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[local_8c8].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar58 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar58 = *(long *)&pGVar2[1].time_range.upper;
  auVar70 = *(undefined1 (*) [16])(lVar58 + (long)p_Var3 * uVar53);
  auVar68 = *(undefined1 (*) [16])(lVar58 + (uVar53 + 1) * (long)p_Var3);
  auVar63 = *(undefined1 (*) [16])(lVar58 + (uVar53 + 2) * (long)p_Var3);
  local_6d8 = local_6d8 - 1 & local_6d8;
  auVar69 = *(undefined1 (*) [16])(lVar58 + (uVar53 + 3) * (long)p_Var3);
  if (local_6d8 != 0) {
    uVar55 = local_6d8 - 1 & local_6d8;
    for (uVar53 = local_6d8; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar64 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar210 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar238._4_4_ = uVar210;
  auVar238._0_4_ = uVar210;
  auVar238._8_4_ = uVar210;
  auVar238._12_4_ = uVar210;
  local_380._16_4_ = uVar210;
  local_380._0_16_ = auVar238;
  local_380._20_4_ = uVar210;
  local_380._24_4_ = uVar210;
  local_380._28_4_ = uVar210;
  local_7e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar248 = ZEXT3264(local_7e0);
  auVar71 = vunpcklps_avx512vl(auVar238,local_7e0._0_16_);
  fVar211 = *(float *)(ray + k * 4 + 0x60);
  auVar242._4_4_ = fVar211;
  auVar242._0_4_ = fVar211;
  auVar242._8_4_ = fVar211;
  auVar242._12_4_ = fVar211;
  local_3a0._16_4_ = fVar211;
  local_3a0._0_16_ = auVar242;
  local_3a0._20_4_ = fVar211;
  local_3a0._24_4_ = fVar211;
  local_3a0._28_4_ = fVar211;
  local_650 = vinsertps_avx(auVar71,auVar242,0x28);
  auVar206._0_4_ = auVar70._0_4_ + auVar68._0_4_ + auVar63._0_4_ + auVar69._0_4_;
  auVar206._4_4_ = auVar70._4_4_ + auVar68._4_4_ + auVar63._4_4_ + auVar69._4_4_;
  auVar206._8_4_ = auVar70._8_4_ + auVar68._8_4_ + auVar63._8_4_ + auVar69._8_4_;
  auVar206._12_4_ = auVar70._12_4_ + auVar68._12_4_ + auVar63._12_4_ + auVar69._12_4_;
  auVar16._8_4_ = 0x3e800000;
  auVar16._0_8_ = 0x3e8000003e800000;
  auVar16._12_4_ = 0x3e800000;
  auVar71 = vmulps_avx512vl(auVar206,auVar16);
  auVar71 = vsubps_avx(auVar71,auVar64);
  auVar71 = vdpps_avx(auVar71,local_650,0x7f);
  fVar146 = *(float *)(ray + k * 4 + 0x30);
  local_660 = vdpps_avx(local_650,local_650,0x7f);
  auVar214._4_12_ = ZEXT812(0) << 0x20;
  auVar214._0_4_ = local_660._0_4_;
  auVar72 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar214);
  auVar73 = vfnmadd213ss_fma(auVar72,local_660,ZEXT416(0x40000000));
  local_200 = auVar71._0_4_ * auVar72._0_4_ * auVar73._0_4_;
  auVar215._4_4_ = local_200;
  auVar215._0_4_ = local_200;
  auVar215._8_4_ = local_200;
  auVar215._12_4_ = local_200;
  fStack_350 = local_200;
  _local_360 = auVar215;
  fStack_34c = local_200;
  fStack_348 = local_200;
  fStack_344 = local_200;
  auVar71 = vfmadd231ps_fma(auVar64,local_650,auVar215);
  auVar71 = vblendps_avx(auVar71,ZEXT816(0) << 0x40,8);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar63 = vsubps_avx(auVar63,auVar71);
  auVar68 = vsubps_avx(auVar68,auVar71);
  auVar69 = vsubps_avx(auVar69,auVar71);
  uVar210 = auVar70._0_4_;
  local_6a0._4_4_ = uVar210;
  local_6a0._0_4_ = uVar210;
  local_6a0._8_4_ = uVar210;
  local_6a0._12_4_ = uVar210;
  local_6a0._16_4_ = uVar210;
  local_6a0._20_4_ = uVar210;
  local_6a0._24_4_ = uVar210;
  local_6a0._28_4_ = uVar210;
  auVar76._8_4_ = 1;
  auVar76._0_8_ = 0x100000001;
  auVar76._12_4_ = 1;
  auVar76._16_4_ = 1;
  auVar76._20_4_ = 1;
  auVar76._24_4_ = 1;
  auVar76._28_4_ = 1;
  local_4e0 = ZEXT1632(auVar70);
  local_7c0 = vpermps_avx2(auVar76,local_4e0);
  auVar235 = ZEXT3264(local_7c0);
  auVar77._8_4_ = 2;
  auVar77._0_8_ = 0x200000002;
  auVar77._12_4_ = 2;
  auVar77._16_4_ = 2;
  auVar77._20_4_ = 2;
  auVar77._24_4_ = 2;
  auVar77._28_4_ = 2;
  local_800 = vpermps_avx512vl(auVar77,local_4e0);
  auVar253 = ZEXT3264(local_800);
  auVar78._8_4_ = 3;
  auVar78._0_8_ = 0x300000003;
  auVar78._12_4_ = 3;
  auVar78._16_4_ = 3;
  auVar78._20_4_ = 3;
  auVar78._24_4_ = 3;
  auVar78._28_4_ = 3;
  local_720 = vpermps_avx512vl(auVar78,local_4e0);
  auVar252 = ZEXT3264(local_720);
  uVar210 = auVar68._0_4_;
  local_560._4_4_ = uVar210;
  local_560._0_4_ = uVar210;
  local_560._8_4_ = uVar210;
  local_560._12_4_ = uVar210;
  local_560._16_4_ = uVar210;
  local_560._20_4_ = uVar210;
  local_560._24_4_ = uVar210;
  local_560._28_4_ = uVar210;
  local_520 = ZEXT1632(auVar68);
  local_640 = vpermps_avx2(auVar76,local_520);
  local_740 = vpermps_avx512vl(auVar77,local_520);
  auVar251 = ZEXT3264(local_740);
  local_820 = vpermps_avx512vl(auVar78,local_520);
  auVar244 = ZEXT3264(local_820);
  auVar233 = ZEXT3264(local_6a0);
  auVar204 = ZEXT3264(local_640);
  local_840 = vbroadcastss_avx512vl(auVar63);
  auVar245 = ZEXT3264(local_840);
  local_500 = ZEXT1632(auVar63);
  local_620 = vpermps_avx512vl(auVar76,local_500);
  auVar246 = ZEXT3264(local_620);
  local_760 = vpermps_avx512vl(auVar77,local_500);
  auVar247 = ZEXT3264(local_760);
  local_860 = vpermps_avx512vl(auVar78,local_500);
  auVar249 = ZEXT3264(local_860);
  local_880 = vbroadcastss_avx512vl(auVar69);
  auVar250 = ZEXT3264(local_880);
  _local_540 = ZEXT1632(auVar69);
  local_780 = vpermps_avx512vl(auVar76,_local_540);
  auVar254 = ZEXT3264(local_780);
  local_8a0 = vpermps_avx512vl(auVar77,_local_540);
  auVar255 = ZEXT3264(local_8a0);
  local_7a0 = vpermps_avx512vl(auVar78,_local_540);
  auVar243 = ZEXT3264(local_7a0);
  auVar188 = ZEXT3264(local_560);
  local_280 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar211 * fVar211)),local_7e0,local_7e0);
  auVar70 = vfmadd231ps_fma(local_280,local_380,local_380);
  local_1e0._0_4_ = auVar70._0_4_;
  local_1e0._4_4_ = local_1e0._0_4_;
  local_1e0._8_4_ = local_1e0._0_4_;
  local_1e0._12_4_ = local_1e0._0_4_;
  local_1e0._16_4_ = local_1e0._0_4_;
  local_1e0._20_4_ = local_1e0._0_4_;
  local_1e0._24_4_ = local_1e0._0_4_;
  local_1e0._28_4_ = local_1e0._0_4_;
  auVar92._8_4_ = 0x7fffffff;
  auVar92._0_8_ = 0x7fffffff7fffffff;
  auVar92._12_4_ = 0x7fffffff;
  auVar92._16_4_ = 0x7fffffff;
  auVar92._20_4_ = 0x7fffffff;
  auVar92._24_4_ = 0x7fffffff;
  auVar92._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar92);
  local_5c0 = ZEXT416((uint)local_200);
  local_200 = fVar146 - local_200;
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  local_450 = vpbroadcastd_avx512vl();
  local_8c0 = 1;
  bVar56 = 0;
  local_460 = vpbroadcastd_avx512vl();
  auVar70 = vsqrtss_avx(local_660,local_660);
  local_8a4 = auVar70._0_4_;
  auVar70 = vsqrtss_avx(local_660,local_660);
  local_8a8 = auVar70._0_4_;
  auVar145 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar197 = ZEXT3264(_DAT_02020f20);
  uVar53 = 0;
  do {
    local_6f0 = auVar145._0_16_;
    auVar70 = vmovshdup_avx(local_6f0);
    auVar209._0_4_ = auVar145._0_4_;
    fVar122 = auVar70._0_4_ - auVar209._0_4_;
    fVar236 = fVar122 * 0.04761905;
    auVar209._4_4_ = auVar209._0_4_;
    auVar209._8_4_ = auVar209._0_4_;
    auVar209._12_4_ = auVar209._0_4_;
    auVar209._16_4_ = auVar209._0_4_;
    auVar209._20_4_ = auVar209._0_4_;
    auVar209._24_4_ = auVar209._0_4_;
    auVar209._28_4_ = auVar209._0_4_;
    local_680._4_4_ = fVar122;
    local_680._0_4_ = fVar122;
    local_680._8_4_ = fVar122;
    local_680._12_4_ = fVar122;
    local_680._16_4_ = fVar122;
    local_680._20_4_ = fVar122;
    local_680._24_4_ = fVar122;
    local_680._28_4_ = fVar122;
    auVar70 = vfmadd231ps_fma(auVar209,local_680,auVar197._0_32_);
    auVar104._8_4_ = 0x3f800000;
    auVar104._0_8_ = &DAT_3f8000003f800000;
    auVar104._12_4_ = 0x3f800000;
    auVar104._16_4_ = 0x3f800000;
    auVar104._20_4_ = 0x3f800000;
    auVar104._24_4_ = 0x3f800000;
    auVar104._28_4_ = 0x3f800000;
    auVar92 = vsubps_avx(auVar104,ZEXT1632(auVar70));
    fVar211 = auVar70._0_4_;
    auVar94._0_4_ = auVar188._0_4_ * fVar211;
    fVar221 = auVar70._4_4_;
    auVar94._4_4_ = auVar188._4_4_ * fVar221;
    fVar222 = auVar70._8_4_;
    auVar94._8_4_ = auVar188._8_4_ * fVar222;
    fVar223 = auVar70._12_4_;
    auVar94._12_4_ = auVar188._12_4_ * fVar223;
    auVar94._16_4_ = auVar188._16_4_ * 0.0;
    auVar94._20_4_ = auVar188._20_4_ * 0.0;
    auVar94._24_4_ = auVar188._24_4_ * 0.0;
    auVar94._28_4_ = 0;
    auVar78 = ZEXT1632(auVar70);
    auVar145._0_4_ = auVar204._0_4_ * fVar211;
    auVar145._4_4_ = auVar204._4_4_ * fVar221;
    auVar145._8_4_ = auVar204._8_4_ * fVar222;
    auVar145._12_4_ = auVar204._12_4_ * fVar223;
    auVar145._16_4_ = auVar204._16_4_ * 0.0;
    auVar145._20_4_ = auVar204._20_4_ * 0.0;
    auVar145._28_36_ = auVar188._28_36_;
    auVar145._24_4_ = auVar204._24_4_ * 0.0;
    auVar76 = vmulps_avx512vl(auVar251._0_32_,auVar78);
    auVar77 = vmulps_avx512vl(auVar244._0_32_,auVar78);
    auVar68 = vfmadd231ps_fma(auVar94,auVar92,auVar233._0_32_);
    auVar63 = vfmadd231ps_fma(auVar145._0_32_,auVar92,auVar235._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar92,auVar253._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar92,auVar252._0_32_);
    auVar78 = vmulps_avx512vl(auVar245._0_32_,auVar78);
    auVar84 = ZEXT1632(auVar70);
    auVar79 = vmulps_avx512vl(auVar246._0_32_,auVar84);
    auVar80 = vmulps_avx512vl(auVar247._0_32_,auVar84);
    auVar81 = vmulps_avx512vl(auVar249._0_32_,auVar84);
    auVar69 = vfmadd231ps_fma(auVar78,auVar92,auVar188._0_32_);
    auVar71 = vfmadd231ps_fma(auVar79,auVar92,auVar204._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar80,auVar92,auVar251._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar81,auVar92,auVar244._0_32_);
    auVar80 = vmulps_avx512vl(auVar250._0_32_,auVar84);
    auVar81 = vmulps_avx512vl(auVar254._0_32_,auVar84);
    auVar82 = vmulps_avx512vl(auVar255._0_32_,auVar84);
    auVar83 = vmulps_avx512vl(auVar243._0_32_,auVar84);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar92,auVar245._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar92,auVar246._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar92,auVar247._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar92,auVar249._0_32_);
    auVar84 = vmulps_avx512vl(auVar84,ZEXT1632(auVar69));
    auVar97 = ZEXT1632(auVar70);
    auVar85 = vmulps_avx512vl(auVar97,ZEXT1632(auVar71));
    auVar86 = vmulps_avx512vl(auVar97,auVar78);
    auVar87 = vmulps_avx512vl(auVar97,auVar79);
    auVar88 = vfmadd231ps_avx512vl(auVar84,auVar92,ZEXT1632(auVar68));
    auVar89 = vfmadd231ps_avx512vl(auVar85,auVar92,ZEXT1632(auVar63));
    auVar90 = vfmadd231ps_avx512vl(auVar86,auVar92,auVar76);
    auVar91 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar77);
    auVar95._0_4_ = auVar80._0_4_ * fVar211;
    auVar95._4_4_ = auVar80._4_4_ * fVar221;
    auVar95._8_4_ = auVar80._8_4_ * fVar222;
    auVar95._12_4_ = auVar80._12_4_ * fVar223;
    auVar95._16_4_ = auVar80._16_4_ * 0.0;
    auVar95._20_4_ = auVar80._20_4_ * 0.0;
    auVar95._24_4_ = auVar80._24_4_ * 0.0;
    auVar95._28_4_ = 0;
    auVar84._4_4_ = auVar81._4_4_ * fVar221;
    auVar84._0_4_ = auVar81._0_4_ * fVar211;
    auVar84._8_4_ = auVar81._8_4_ * fVar222;
    auVar84._12_4_ = auVar81._12_4_ * fVar223;
    auVar84._16_4_ = auVar81._16_4_ * 0.0;
    auVar84._20_4_ = auVar81._20_4_ * 0.0;
    auVar84._24_4_ = auVar81._24_4_ * 0.0;
    auVar84._28_4_ = auVar80._28_4_;
    auVar85._4_4_ = auVar82._4_4_ * fVar221;
    auVar85._0_4_ = auVar82._0_4_ * fVar211;
    auVar85._8_4_ = auVar82._8_4_ * fVar222;
    auVar85._12_4_ = auVar82._12_4_ * fVar223;
    auVar85._16_4_ = auVar82._16_4_ * 0.0;
    auVar85._20_4_ = auVar82._20_4_ * 0.0;
    auVar85._24_4_ = auVar82._24_4_ * 0.0;
    auVar85._28_4_ = auVar81._28_4_;
    auVar86._4_4_ = auVar83._4_4_ * fVar221;
    auVar86._0_4_ = auVar83._0_4_ * fVar211;
    auVar86._8_4_ = auVar83._8_4_ * fVar222;
    auVar86._12_4_ = auVar83._12_4_ * fVar223;
    auVar86._16_4_ = auVar83._16_4_ * 0.0;
    auVar86._20_4_ = auVar83._20_4_ * 0.0;
    auVar86._24_4_ = auVar83._24_4_ * 0.0;
    auVar86._28_4_ = auVar82._28_4_;
    auVar70 = vfmadd231ps_fma(auVar95,auVar92,ZEXT1632(auVar69));
    auVar68 = vfmadd231ps_fma(auVar84,auVar92,ZEXT1632(auVar71));
    auVar63 = vfmadd231ps_fma(auVar85,auVar92,auVar78);
    auVar69 = vfmadd231ps_fma(auVar86,auVar92,auVar79);
    auVar87._28_4_ = auVar77._28_4_;
    auVar87._0_28_ =
         ZEXT1628(CONCAT412(fVar223 * auVar70._12_4_,
                            CONCAT48(fVar222 * auVar70._8_4_,
                                     CONCAT44(fVar221 * auVar70._4_4_,fVar211 * auVar70._0_4_))));
    auVar93._28_4_ = auVar76._28_4_;
    auVar93._0_28_ =
         ZEXT1628(CONCAT412(auVar68._12_4_ * fVar223,
                            CONCAT48(auVar68._8_4_ * fVar222,
                                     CONCAT44(auVar68._4_4_ * fVar221,auVar68._0_4_ * fVar211))));
    auVar76 = vmulps_avx512vl(auVar97,ZEXT1632(auVar63));
    auVar84 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar88);
    auVar85 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar89);
    local_600 = vfmadd231ps_avx512vl(auVar76,auVar92,auVar90);
    auVar77 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar69._12_4_ * fVar223,
                                            CONCAT48(auVar69._8_4_ * fVar222,
                                                     CONCAT44(auVar69._4_4_ * fVar221,
                                                              auVar69._0_4_ * fVar211)))),auVar91,
                         auVar92);
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar70),auVar88);
    auVar76 = vsubps_avx512vl(ZEXT1632(auVar68),auVar89);
    auVar78 = vsubps_avx512vl(ZEXT1632(auVar63),auVar90);
    auVar80 = vsubps_avx512vl(ZEXT1632(auVar69),auVar91);
    auVar88._4_4_ = fVar236 * auVar92._4_4_ * 3.0;
    auVar88._0_4_ = fVar236 * auVar92._0_4_ * 3.0;
    auVar88._8_4_ = fVar236 * auVar92._8_4_ * 3.0;
    auVar88._12_4_ = fVar236 * auVar92._12_4_ * 3.0;
    auVar88._16_4_ = fVar236 * auVar92._16_4_ * 3.0;
    auVar88._20_4_ = fVar236 * auVar92._20_4_ * 3.0;
    auVar88._24_4_ = fVar236 * auVar92._24_4_ * 3.0;
    auVar88._28_4_ = auVar79._28_4_;
    auVar105._0_4_ = fVar236 * auVar76._0_4_ * 3.0;
    auVar105._4_4_ = fVar236 * auVar76._4_4_ * 3.0;
    auVar105._8_4_ = fVar236 * auVar76._8_4_ * 3.0;
    auVar105._12_4_ = fVar236 * auVar76._12_4_ * 3.0;
    auVar105._16_4_ = fVar236 * auVar76._16_4_ * 3.0;
    auVar105._20_4_ = fVar236 * auVar76._20_4_ * 3.0;
    auVar105._24_4_ = fVar236 * auVar76._24_4_ * 3.0;
    auVar105._28_4_ = 0;
    auVar106._0_4_ = auVar78._0_4_ * 3.0 * fVar236;
    auVar106._4_4_ = auVar78._4_4_ * 3.0 * fVar236;
    auVar106._8_4_ = auVar78._8_4_ * 3.0 * fVar236;
    auVar106._12_4_ = auVar78._12_4_ * 3.0 * fVar236;
    auVar106._16_4_ = auVar78._16_4_ * 3.0 * fVar236;
    auVar106._20_4_ = auVar78._20_4_ * 3.0 * fVar236;
    auVar106._24_4_ = auVar78._24_4_ * 3.0 * fVar236;
    auVar106._28_4_ = 0;
    fVar211 = auVar80._0_4_ * 3.0 * fVar236;
    fVar221 = auVar80._4_4_ * 3.0 * fVar236;
    auVar89._4_4_ = fVar221;
    auVar89._0_4_ = fVar211;
    fVar222 = auVar80._8_4_ * 3.0 * fVar236;
    auVar89._8_4_ = fVar222;
    fVar223 = auVar80._12_4_ * 3.0 * fVar236;
    auVar89._12_4_ = fVar223;
    fVar224 = auVar80._16_4_ * 3.0 * fVar236;
    auVar89._16_4_ = fVar224;
    fVar225 = auVar80._20_4_ * 3.0 * fVar236;
    auVar89._20_4_ = fVar225;
    fVar226 = auVar80._24_4_ * 3.0 * fVar236;
    auVar89._24_4_ = fVar226;
    auVar89._28_4_ = fVar236;
    auVar70 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar86 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,ZEXT1632(auVar70));
    auVar87 = vpermt2ps_avx512vl(auVar85,_DAT_0205fd20,ZEXT1632(auVar70));
    auVar78 = ZEXT1632(auVar70);
    auVar93 = vpermt2ps_avx512vl(local_600,_DAT_0205fd20,auVar78);
    auVar96._0_4_ = auVar77._0_4_ + fVar211;
    auVar96._4_4_ = auVar77._4_4_ + fVar221;
    auVar96._8_4_ = auVar77._8_4_ + fVar222;
    auVar96._12_4_ = auVar77._12_4_ + fVar223;
    auVar96._16_4_ = auVar77._16_4_ + fVar224;
    auVar96._20_4_ = auVar77._20_4_ + fVar225;
    auVar96._24_4_ = auVar77._24_4_ + fVar226;
    auVar96._28_4_ = auVar77._28_4_ + fVar236;
    auVar92 = vmaxps_avx(auVar77,auVar96);
    auVar76 = vminps_avx(auVar77,auVar96);
    auVar79 = vpermt2ps_avx512vl(auVar77,_DAT_0205fd20,auVar78);
    auVar94 = vpermt2ps_avx512vl(auVar88,_DAT_0205fd20,auVar78);
    auVar95 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,auVar78);
    auVar102 = ZEXT1632(auVar70);
    auVar96 = vpermt2ps_avx512vl(auVar106,_DAT_0205fd20,auVar102);
    auVar77 = vpermt2ps_avx512vl(auVar89,_DAT_0205fd20,auVar102);
    auVar80 = vsubps_avx512vl(auVar79,auVar77);
    auVar77 = vsubps_avx(auVar86,auVar84);
    auVar78 = vsubps_avx(auVar87,auVar85);
    auVar89 = vsubps_avx512vl(auVar93,local_600);
    auVar81 = vmulps_avx512vl(auVar78,auVar106);
    auVar81 = vfmsub231ps_avx512vl(auVar81,auVar105,auVar89);
    auVar82 = vmulps_avx512vl(auVar89,auVar88);
    auVar82 = vfmsub231ps_avx512vl(auVar82,auVar106,auVar77);
    auVar83 = vmulps_avx512vl(auVar77,auVar105);
    auVar83 = vfmsub231ps_avx512vl(auVar83,auVar88,auVar78);
    auVar83 = vmulps_avx512vl(auVar83,auVar83);
    auVar82 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar82);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar81,auVar81);
    auVar82 = vmulps_avx512vl(auVar89,auVar89);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar78,auVar78);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar77,auVar77);
    auVar83 = vrcp14ps_avx512vl(auVar82);
    auVar90 = vfnmadd213ps_avx512vl(auVar83,auVar82,auVar104);
    auVar83 = vfmadd132ps_avx512vl(auVar90,auVar83,auVar83);
    auVar81 = vmulps_avx512vl(auVar81,auVar83);
    auVar90 = vmulps_avx512vl(auVar78,auVar96);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar95,auVar89);
    auVar91 = vmulps_avx512vl(auVar89,auVar94);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar96,auVar77);
    auVar97 = vmulps_avx512vl(auVar77,auVar95);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar94,auVar78);
    auVar97 = vmulps_avx512vl(auVar97,auVar97);
    auVar91 = vfmadd231ps_avx512vl(auVar97,auVar91,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar90,auVar90);
    auVar83 = vmulps_avx512vl(auVar90,auVar83);
    auVar81 = vmaxps_avx512vl(auVar81,auVar83);
    auVar81 = vsqrtps_avx512vl(auVar81);
    auVar83 = vmaxps_avx512vl(auVar80,auVar79);
    auVar92 = vmaxps_avx512vl(auVar92,auVar83);
    auVar83 = vaddps_avx512vl(auVar81,auVar92);
    auVar92 = vminps_avx512vl(auVar80,auVar79);
    auVar92 = vminps_avx(auVar76,auVar92);
    auVar92 = vsubps_avx512vl(auVar92,auVar81);
    auVar79._8_4_ = 0x3f800002;
    auVar79._0_8_ = 0x3f8000023f800002;
    auVar79._12_4_ = 0x3f800002;
    auVar79._16_4_ = 0x3f800002;
    auVar79._20_4_ = 0x3f800002;
    auVar79._24_4_ = 0x3f800002;
    auVar79._28_4_ = 0x3f800002;
    auVar76 = vmulps_avx512vl(auVar83,auVar79);
    auVar80._8_4_ = 0x3f7ffffc;
    auVar80._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar80._12_4_ = 0x3f7ffffc;
    auVar80._16_4_ = 0x3f7ffffc;
    auVar80._20_4_ = 0x3f7ffffc;
    auVar80._24_4_ = 0x3f7ffffc;
    auVar80._28_4_ = 0x3f7ffffc;
    auVar92 = vmulps_avx512vl(auVar92,auVar80);
    auVar90._4_4_ = auVar76._4_4_ * auVar76._4_4_;
    auVar90._0_4_ = auVar76._0_4_ * auVar76._0_4_;
    auVar90._8_4_ = auVar76._8_4_ * auVar76._8_4_;
    auVar90._12_4_ = auVar76._12_4_ * auVar76._12_4_;
    auVar90._16_4_ = auVar76._16_4_ * auVar76._16_4_;
    auVar90._20_4_ = auVar76._20_4_ * auVar76._20_4_;
    auVar90._24_4_ = auVar76._24_4_ * auVar76._24_4_;
    auVar90._28_4_ = auVar92._28_4_;
    auVar76 = vrsqrt14ps_avx512vl(auVar82);
    auVar81._8_4_ = 0xbf000000;
    auVar81._0_8_ = 0xbf000000bf000000;
    auVar81._12_4_ = 0xbf000000;
    auVar81._16_4_ = 0xbf000000;
    auVar81._20_4_ = 0xbf000000;
    auVar81._24_4_ = 0xbf000000;
    auVar81._28_4_ = 0xbf000000;
    auVar79 = vmulps_avx512vl(auVar82,auVar81);
    auVar91._4_4_ = auVar76._4_4_ * auVar79._4_4_;
    auVar91._0_4_ = auVar76._0_4_ * auVar79._0_4_;
    auVar91._8_4_ = auVar76._8_4_ * auVar79._8_4_;
    auVar91._12_4_ = auVar76._12_4_ * auVar79._12_4_;
    auVar91._16_4_ = auVar76._16_4_ * auVar79._16_4_;
    auVar91._20_4_ = auVar76._20_4_ * auVar79._20_4_;
    auVar91._24_4_ = auVar76._24_4_ * auVar79._24_4_;
    auVar91._28_4_ = auVar79._28_4_;
    auVar79 = vmulps_avx512vl(auVar76,auVar76);
    auVar79 = vmulps_avx512vl(auVar79,auVar91);
    auVar82._8_4_ = 0x3fc00000;
    auVar82._0_8_ = 0x3fc000003fc00000;
    auVar82._12_4_ = 0x3fc00000;
    auVar82._16_4_ = 0x3fc00000;
    auVar82._20_4_ = 0x3fc00000;
    auVar82._24_4_ = 0x3fc00000;
    auVar82._28_4_ = 0x3fc00000;
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar82);
    auVar97._4_4_ = auVar79._4_4_ * auVar77._4_4_;
    auVar97._0_4_ = auVar79._0_4_ * auVar77._0_4_;
    auVar97._8_4_ = auVar79._8_4_ * auVar77._8_4_;
    auVar97._12_4_ = auVar79._12_4_ * auVar77._12_4_;
    auVar97._16_4_ = auVar79._16_4_ * auVar77._16_4_;
    auVar97._20_4_ = auVar79._20_4_ * auVar77._20_4_;
    auVar97._24_4_ = auVar79._24_4_ * auVar77._24_4_;
    auVar97._28_4_ = auVar76._28_4_;
    auVar76 = vmulps_avx512vl(auVar78,auVar79);
    auVar80 = vmulps_avx512vl(auVar89,auVar79);
    auVar81 = vsubps_avx512vl(auVar102,auVar84);
    auVar82 = vsubps_avx512vl(auVar102,auVar85);
    auVar91 = vsubps_avx512vl(auVar102,local_600);
    auVar83 = vmulps_avx512vl(local_3a0,auVar91);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar248._0_32_,auVar82);
    auVar83 = vfmadd231ps_avx512vl(auVar83,local_380,auVar81);
    auVar98 = vmulps_avx512vl(auVar91,auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar82,auVar82);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar81,auVar81);
    auVar99 = vmulps_avx512vl(local_3a0,auVar80);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar76,auVar248._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_380);
    auVar80 = vmulps_avx512vl(auVar91,auVar80);
    auVar76 = vfmadd231ps_avx512vl(auVar80,auVar82,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar81,auVar97);
    local_4a0 = vmulps_avx512vl(auVar99,auVar99);
    auVar80 = vsubps_avx512vl(local_1e0,local_4a0);
    auVar97 = vmulps_avx512vl(auVar99,auVar76);
    auVar83 = vsubps_avx512vl(auVar83,auVar97);
    auVar97 = vaddps_avx512vl(auVar83,auVar83);
    auVar83 = vmulps_avx512vl(auVar76,auVar76);
    auVar98 = vsubps_avx512vl(auVar98,auVar83);
    auVar90 = vsubps_avx512vl(auVar98,auVar90);
    auVar100 = vmulps_avx512vl(auVar97,auVar97);
    auVar83._8_4_ = 0x40800000;
    auVar83._0_8_ = 0x4080000040800000;
    auVar83._12_4_ = 0x40800000;
    auVar83._16_4_ = 0x40800000;
    auVar83._20_4_ = 0x40800000;
    auVar83._24_4_ = 0x40800000;
    auVar83._28_4_ = 0x40800000;
    auVar83 = vmulps_avx512vl(auVar80,auVar83);
    auVar101 = vmulps_avx512vl(auVar83,auVar90);
    auVar101 = vsubps_avx512vl(auVar100,auVar101);
    uVar55 = vcmpps_avx512vl(auVar101,auVar102,5);
    bVar49 = (byte)uVar55;
    if (bVar49 == 0) {
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar101 = vsqrtps_avx512vl(auVar101);
      auVar102 = vaddps_avx512vl(auVar80,auVar80);
      auVar103 = vrcp14ps_avx512vl(auVar102);
      auVar104 = vfnmadd213ps_avx512vl(auVar102,auVar103,auVar104);
      auVar104 = vfmadd132ps_avx512vl(auVar104,auVar103,auVar103);
      auVar103._8_4_ = 0x80000000;
      auVar103._0_8_ = 0x8000000080000000;
      auVar103._12_4_ = 0x80000000;
      auVar103._16_4_ = 0x80000000;
      auVar103._20_4_ = 0x80000000;
      auVar103._24_4_ = 0x80000000;
      auVar103._28_4_ = 0x80000000;
      auVar102 = vxorps_avx512vl(auVar97,auVar103);
      auVar102 = vsubps_avx512vl(auVar102,auVar101);
      auVar102 = vmulps_avx512vl(auVar102,auVar104);
      auVar101 = vsubps_avx512vl(auVar101,auVar97);
      auVar104 = vmulps_avx512vl(auVar101,auVar104);
      auVar101 = vfmadd213ps_avx512vl(auVar99,auVar102,auVar76);
      local_2e0 = vmulps_avx512vl(auVar79,auVar101);
      auVar101 = vfmadd213ps_avx512vl(auVar99,auVar104,auVar76);
      local_300 = vmulps_avx512vl(auVar79,auVar101);
      auVar134._8_4_ = 0x7f800000;
      auVar134._0_8_ = 0x7f8000007f800000;
      auVar134._12_4_ = 0x7f800000;
      auVar134._16_4_ = 0x7f800000;
      auVar134._20_4_ = 0x7f800000;
      auVar134._24_4_ = 0x7f800000;
      auVar134._28_4_ = 0x7f800000;
      auVar102 = vblendmps_avx512vl(auVar134,auVar102);
      auVar101._0_4_ =
           (uint)(bVar49 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar49 & 1) * local_300._0_4_;
      bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar101._4_4_ = (uint)bVar60 * auVar102._4_4_ | (uint)!bVar60 * local_300._4_4_;
      bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar101._8_4_ = (uint)bVar60 * auVar102._8_4_ | (uint)!bVar60 * local_300._8_4_;
      bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar101._12_4_ = (uint)bVar60 * auVar102._12_4_ | (uint)!bVar60 * local_300._12_4_;
      bVar60 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar101._16_4_ = (uint)bVar60 * auVar102._16_4_ | (uint)!bVar60 * local_300._16_4_;
      bVar60 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar101._20_4_ = (uint)bVar60 * auVar102._20_4_ | (uint)!bVar60 * local_300._20_4_;
      bVar60 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar101._24_4_ = (uint)bVar60 * auVar102._24_4_ | (uint)!bVar60 * local_300._24_4_;
      bVar60 = SUB81(uVar55 >> 7,0);
      auVar101._28_4_ = (uint)bVar60 * auVar102._28_4_ | (uint)!bVar60 * local_300._28_4_;
      auVar135._8_4_ = 0xff800000;
      auVar135._0_8_ = 0xff800000ff800000;
      auVar135._12_4_ = 0xff800000;
      auVar135._16_4_ = 0xff800000;
      auVar135._20_4_ = 0xff800000;
      auVar135._24_4_ = 0xff800000;
      auVar135._28_4_ = 0xff800000;
      auVar103 = vblendmps_avx512vl(auVar135,auVar104);
      auVar102._0_4_ =
           (uint)(bVar49 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar49 & 1) * auVar104._0_4_;
      bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar102._4_4_ = (uint)bVar60 * auVar103._4_4_ | (uint)!bVar60 * auVar104._4_4_;
      bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar102._8_4_ = (uint)bVar60 * auVar103._8_4_ | (uint)!bVar60 * auVar104._8_4_;
      bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar102._12_4_ = (uint)bVar60 * auVar103._12_4_ | (uint)!bVar60 * auVar104._12_4_;
      bVar60 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar102._16_4_ = (uint)bVar60 * auVar103._16_4_ | (uint)!bVar60 * auVar104._16_4_;
      bVar60 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar102._20_4_ = (uint)bVar60 * auVar103._20_4_ | (uint)!bVar60 * auVar104._20_4_;
      bVar60 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar102._24_4_ = (uint)bVar60 * auVar103._24_4_ | (uint)!bVar60 * auVar104._24_4_;
      bVar60 = SUB81(uVar55 >> 7,0);
      auVar102._28_4_ = (uint)bVar60 * auVar103._28_4_ | (uint)!bVar60 * auVar104._28_4_;
      auVar136._8_4_ = 0x7fffffff;
      auVar136._0_8_ = 0x7fffffff7fffffff;
      auVar136._12_4_ = 0x7fffffff;
      auVar136._16_4_ = 0x7fffffff;
      auVar136._20_4_ = 0x7fffffff;
      auVar136._24_4_ = 0x7fffffff;
      auVar136._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_4a0,auVar136);
      auVar104 = vmaxps_avx512vl(local_280,local_4a0);
      auVar107._8_4_ = 0x36000000;
      auVar107._0_8_ = 0x3600000036000000;
      auVar107._12_4_ = 0x36000000;
      auVar107._16_4_ = 0x36000000;
      auVar107._20_4_ = 0x36000000;
      auVar107._24_4_ = 0x36000000;
      auVar107._28_4_ = 0x36000000;
      auVar103 = vmulps_avx512vl(auVar104,auVar107);
      auVar104 = vandps_avx(auVar80,auVar136);
      uVar54 = vcmpps_avx512vl(auVar104,auVar103,1);
      uVar55 = uVar55 & uVar54;
      bVar57 = (byte)uVar55;
      if (bVar57 != 0) {
        uVar54 = vcmpps_avx512vl(auVar90,_DAT_02020f00,2);
        auVar167._8_4_ = 0xff800000;
        auVar167._0_8_ = 0xff800000ff800000;
        auVar167._12_4_ = 0xff800000;
        auVar167._16_4_ = 0xff800000;
        auVar167._20_4_ = 0xff800000;
        auVar167._24_4_ = 0xff800000;
        auVar167._28_4_ = 0xff800000;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar103 = vblendmps_avx512vl(auVar90,auVar167);
        bVar52 = (byte)uVar54;
        uVar51 = (uint)(bVar52 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar104._0_4_;
        bVar60 = (bool)((byte)(uVar54 >> 1) & 1);
        uVar115 = (uint)bVar60 * auVar103._4_4_ | (uint)!bVar60 * auVar104._4_4_;
        bVar60 = (bool)((byte)(uVar54 >> 2) & 1);
        uVar116 = (uint)bVar60 * auVar103._8_4_ | (uint)!bVar60 * auVar104._8_4_;
        bVar60 = (bool)((byte)(uVar54 >> 3) & 1);
        uVar117 = (uint)bVar60 * auVar103._12_4_ | (uint)!bVar60 * auVar104._12_4_;
        bVar60 = (bool)((byte)(uVar54 >> 4) & 1);
        uVar118 = (uint)bVar60 * auVar103._16_4_ | (uint)!bVar60 * auVar104._16_4_;
        bVar60 = (bool)((byte)(uVar54 >> 5) & 1);
        uVar119 = (uint)bVar60 * auVar103._20_4_ | (uint)!bVar60 * auVar104._20_4_;
        bVar60 = (bool)((byte)(uVar54 >> 6) & 1);
        uVar120 = (uint)bVar60 * auVar103._24_4_ | (uint)!bVar60 * auVar104._24_4_;
        bVar60 = SUB81(uVar54 >> 7,0);
        uVar121 = (uint)bVar60 * auVar103._28_4_ | (uint)!bVar60 * auVar104._28_4_;
        auVar101._0_4_ = (bVar57 & 1) * uVar51 | !(bool)(bVar57 & 1) * auVar101._0_4_;
        bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar101._4_4_ = bVar60 * uVar115 | !bVar60 * auVar101._4_4_;
        bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar101._8_4_ = bVar60 * uVar116 | !bVar60 * auVar101._8_4_;
        bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar101._12_4_ = bVar60 * uVar117 | !bVar60 * auVar101._12_4_;
        bVar60 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar101._16_4_ = bVar60 * uVar118 | !bVar60 * auVar101._16_4_;
        bVar60 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar101._20_4_ = bVar60 * uVar119 | !bVar60 * auVar101._20_4_;
        bVar60 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar101._24_4_ = bVar60 * uVar120 | !bVar60 * auVar101._24_4_;
        bVar60 = SUB81(uVar55 >> 7,0);
        auVar101._28_4_ = bVar60 * uVar121 | !bVar60 * auVar101._28_4_;
        auVar90 = vblendmps_avx512vl(auVar167,auVar90);
        bVar60 = (bool)((byte)(uVar54 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar54 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar54 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar54 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar54 >> 6) & 1);
        bVar10 = SUB81(uVar54 >> 7,0);
        auVar102._0_4_ =
             (uint)(bVar57 & 1) *
             ((uint)(bVar52 & 1) * auVar90._0_4_ | !(bool)(bVar52 & 1) * uVar51) |
             !(bool)(bVar57 & 1) * auVar102._0_4_;
        bVar4 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar102._4_4_ =
             (uint)bVar4 * ((uint)bVar60 * auVar90._4_4_ | !bVar60 * uVar115) |
             !bVar4 * auVar102._4_4_;
        bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar102._8_4_ =
             (uint)bVar60 * ((uint)bVar5 * auVar90._8_4_ | !bVar5 * uVar116) |
             !bVar60 * auVar102._8_4_;
        bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar102._12_4_ =
             (uint)bVar60 * ((uint)bVar6 * auVar90._12_4_ | !bVar6 * uVar117) |
             !bVar60 * auVar102._12_4_;
        bVar60 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar102._16_4_ =
             (uint)bVar60 * ((uint)bVar7 * auVar90._16_4_ | !bVar7 * uVar118) |
             !bVar60 * auVar102._16_4_;
        bVar60 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar102._20_4_ =
             (uint)bVar60 * ((uint)bVar8 * auVar90._20_4_ | !bVar8 * uVar119) |
             !bVar60 * auVar102._20_4_;
        bVar60 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar102._24_4_ =
             (uint)bVar60 * ((uint)bVar9 * auVar90._24_4_ | !bVar9 * uVar120) |
             !bVar60 * auVar102._24_4_;
        bVar60 = SUB81(uVar55 >> 7,0);
        auVar102._28_4_ =
             (uint)bVar60 * ((uint)bVar10 * auVar90._28_4_ | !bVar10 * uVar121) |
             !bVar60 * auVar102._28_4_;
        bVar49 = (~bVar57 | bVar52) & bVar49;
      }
    }
    in_ZMM31 = ZEXT3264(auVar102);
    if ((bVar49 & 0x7f) == 0) {
LAB_01b88086:
      auVar197 = ZEXT3264(_DAT_02020f20);
      auVar248 = ZEXT3264(local_7e0);
      auVar233 = ZEXT3264(local_6a0);
      auVar235 = ZEXT3264(local_7c0);
      auVar253 = ZEXT3264(local_800);
      auVar252 = ZEXT3264(local_720);
      auVar188 = ZEXT3264(local_560);
      auVar204 = ZEXT3264(local_640);
      auVar251 = ZEXT3264(local_740);
      auVar244 = ZEXT3264(local_820);
      auVar245 = ZEXT3264(local_840);
      auVar246 = ZEXT3264(local_620);
      auVar247 = ZEXT3264(local_760);
      auVar249 = ZEXT3264(local_860);
      auVar250 = ZEXT3264(local_880);
      auVar254 = ZEXT3264(local_780);
      auVar255 = ZEXT3264(local_8a0);
      auVar243 = ZEXT3264(local_7a0);
      auVar145 = ZEXT1664(local_6f0);
    }
    else {
      fVar211 = *(float *)(ray + k * 4 + 0x80) - (float)local_5c0._0_4_;
      auVar137._4_4_ = fVar211;
      auVar137._0_4_ = fVar211;
      auVar137._8_4_ = fVar211;
      auVar137._12_4_ = fVar211;
      auVar137._16_4_ = fVar211;
      auVar137._20_4_ = fVar211;
      auVar137._24_4_ = fVar211;
      auVar137._28_4_ = fVar211;
      auVar90 = vminps_avx512vl(auVar137,auVar102);
      auVar48._4_4_ = fStack_1fc;
      auVar48._0_4_ = local_200;
      auVar48._8_4_ = fStack_1f8;
      auVar48._12_4_ = fStack_1f4;
      auVar48._16_4_ = fStack_1f0;
      auVar48._20_4_ = fStack_1ec;
      auVar48._24_4_ = fStack_1e8;
      auVar48._28_4_ = fStack_1e4;
      auVar101 = vmaxps_avx512vl(auVar48,auVar101);
      auVar91 = vmulps_avx512vl(auVar91,auVar106);
      auVar82 = vfmadd213ps_avx512vl(auVar82,auVar105,auVar91);
      auVar81 = vfmadd213ps_avx512vl(auVar81,auVar88,auVar82);
      auVar82 = vmulps_avx512vl(local_3a0,auVar106);
      auVar82 = vfmadd231ps_avx512vl(auVar82,local_7e0,auVar105);
      auVar82 = vfmadd231ps_avx512vl(auVar82,local_380,auVar88);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar82,auVar88);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar88,auVar91,1);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar104);
      auVar81 = vxorps_avx512vl(auVar81,auVar104);
      auVar105 = vrcp14ps_avx512vl(auVar82);
      auVar106 = vxorps_avx512vl(auVar82,auVar104);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar103 = vfnmadd213ps_avx512vl(auVar105,auVar82,auVar102);
      auVar103 = vfmadd132ps_avx512vl(auVar103,auVar105,auVar105);
      auVar103 = vmulps_avx512vl(auVar103,auVar81);
      uVar13 = vcmpps_avx512vl(auVar82,auVar106,1);
      bVar57 = (byte)uVar12 | (byte)uVar13;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar81 = vblendmps_avx512vl(auVar103,auVar107);
      auVar108._0_4_ =
           (uint)(bVar57 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar105._0_4_;
      bVar60 = (bool)(bVar57 >> 1 & 1);
      auVar108._4_4_ = (uint)bVar60 * auVar81._4_4_ | (uint)!bVar60 * auVar105._4_4_;
      bVar60 = (bool)(bVar57 >> 2 & 1);
      auVar108._8_4_ = (uint)bVar60 * auVar81._8_4_ | (uint)!bVar60 * auVar105._8_4_;
      bVar60 = (bool)(bVar57 >> 3 & 1);
      auVar108._12_4_ = (uint)bVar60 * auVar81._12_4_ | (uint)!bVar60 * auVar105._12_4_;
      bVar60 = (bool)(bVar57 >> 4 & 1);
      auVar108._16_4_ = (uint)bVar60 * auVar81._16_4_ | (uint)!bVar60 * auVar105._16_4_;
      bVar60 = (bool)(bVar57 >> 5 & 1);
      auVar108._20_4_ = (uint)bVar60 * auVar81._20_4_ | (uint)!bVar60 * auVar105._20_4_;
      bVar60 = (bool)(bVar57 >> 6 & 1);
      auVar108._24_4_ = (uint)bVar60 * auVar81._24_4_ | (uint)!bVar60 * auVar105._24_4_;
      auVar108._28_4_ =
           (uint)(bVar57 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar105._28_4_;
      auVar81 = vmaxps_avx(auVar101,auVar108);
      uVar13 = vcmpps_avx512vl(auVar82,auVar106,6);
      bVar57 = (byte)uVar12 | (byte)uVar13;
      auVar109._0_4_ = (uint)(bVar57 & 1) * 0x7f800000 | (uint)!(bool)(bVar57 & 1) * auVar103._0_4_;
      bVar60 = (bool)(bVar57 >> 1 & 1);
      auVar109._4_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * auVar103._4_4_;
      bVar60 = (bool)(bVar57 >> 2 & 1);
      auVar109._8_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * auVar103._8_4_;
      bVar60 = (bool)(bVar57 >> 3 & 1);
      auVar109._12_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * auVar103._12_4_;
      bVar60 = (bool)(bVar57 >> 4 & 1);
      auVar109._16_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * auVar103._16_4_;
      bVar60 = (bool)(bVar57 >> 5 & 1);
      auVar109._20_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * auVar103._20_4_;
      bVar60 = (bool)(bVar57 >> 6 & 1);
      auVar109._24_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * auVar103._24_4_;
      auVar109._28_4_ =
           (uint)(bVar57 >> 7) * 0x7f800000 | (uint)!(bool)(bVar57 >> 7) * auVar103._28_4_;
      auVar82 = vminps_avx(auVar90,auVar109);
      auVar70 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar70),auVar86);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar70),auVar87);
      auVar101 = ZEXT1632(auVar70);
      auVar93 = vsubps_avx512vl(auVar101,auVar93);
      auVar31._4_4_ = auVar93._4_4_ * auVar96._4_4_;
      auVar31._0_4_ = auVar93._0_4_ * auVar96._0_4_;
      auVar31._8_4_ = auVar93._8_4_ * auVar96._8_4_;
      auVar31._12_4_ = auVar93._12_4_ * auVar96._12_4_;
      auVar31._16_4_ = auVar93._16_4_ * auVar96._16_4_;
      auVar31._20_4_ = auVar93._20_4_ * auVar96._20_4_;
      auVar31._24_4_ = auVar93._24_4_ * auVar96._24_4_;
      auVar31._28_4_ = auVar93._28_4_;
      auVar87 = vfnmsub231ps_avx512vl(auVar31,auVar95,auVar87);
      auVar86 = vfnmadd231ps_avx512vl(auVar87,auVar94,auVar86);
      auVar87 = vmulps_avx512vl(local_3a0,auVar96);
      auVar87 = vfnmsub231ps_avx512vl(auVar87,local_7e0,auVar95);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,local_380,auVar94);
      vandps_avx512vl(auVar87,auVar88);
      uVar12 = vcmpps_avx512vl(auVar87,auVar91,1);
      auVar86 = vxorps_avx512vl(auVar86,auVar104);
      auVar93 = vrcp14ps_avx512vl(auVar87);
      auVar88 = vxorps_avx512vl(auVar87,auVar104);
      auVar90 = vfnmadd213ps_avx512vl(auVar93,auVar87,auVar102);
      auVar70 = vfmadd132ps_fma(auVar90,auVar93,auVar93);
      fVar211 = auVar70._0_4_ * auVar86._0_4_;
      fVar221 = auVar70._4_4_ * auVar86._4_4_;
      auVar32._4_4_ = fVar221;
      auVar32._0_4_ = fVar211;
      fVar222 = auVar70._8_4_ * auVar86._8_4_;
      auVar32._8_4_ = fVar222;
      fVar223 = auVar70._12_4_ * auVar86._12_4_;
      auVar32._12_4_ = fVar223;
      fVar236 = auVar86._16_4_ * 0.0;
      auVar32._16_4_ = fVar236;
      fVar224 = auVar86._20_4_ * 0.0;
      auVar32._20_4_ = fVar224;
      fVar225 = auVar86._24_4_ * 0.0;
      auVar32._24_4_ = fVar225;
      auVar32._28_4_ = auVar86._28_4_;
      uVar13 = vcmpps_avx512vl(auVar87,auVar88,1);
      bVar57 = (byte)uVar12 | (byte)uVar13;
      auVar90 = vblendmps_avx512vl(auVar32,auVar107);
      auVar110._0_4_ =
           (uint)(bVar57 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar93._0_4_;
      bVar60 = (bool)(bVar57 >> 1 & 1);
      auVar110._4_4_ = (uint)bVar60 * auVar90._4_4_ | (uint)!bVar60 * auVar93._4_4_;
      bVar60 = (bool)(bVar57 >> 2 & 1);
      auVar110._8_4_ = (uint)bVar60 * auVar90._8_4_ | (uint)!bVar60 * auVar93._8_4_;
      bVar60 = (bool)(bVar57 >> 3 & 1);
      auVar110._12_4_ = (uint)bVar60 * auVar90._12_4_ | (uint)!bVar60 * auVar93._12_4_;
      bVar60 = (bool)(bVar57 >> 4 & 1);
      auVar110._16_4_ = (uint)bVar60 * auVar90._16_4_ | (uint)!bVar60 * auVar93._16_4_;
      bVar60 = (bool)(bVar57 >> 5 & 1);
      auVar110._20_4_ = (uint)bVar60 * auVar90._20_4_ | (uint)!bVar60 * auVar93._20_4_;
      bVar60 = (bool)(bVar57 >> 6 & 1);
      auVar110._24_4_ = (uint)bVar60 * auVar90._24_4_ | (uint)!bVar60 * auVar93._24_4_;
      auVar110._28_4_ =
           (uint)(bVar57 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar93._28_4_;
      _local_4c0 = vmaxps_avx(auVar81,auVar110);
      uVar13 = vcmpps_avx512vl(auVar87,auVar88,6);
      bVar57 = (byte)uVar12 | (byte)uVar13;
      auVar111._0_4_ = (uint)(bVar57 & 1) * 0x7f800000 | (uint)!(bool)(bVar57 & 1) * (int)fVar211;
      bVar60 = (bool)(bVar57 >> 1 & 1);
      auVar111._4_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar221;
      bVar60 = (bool)(bVar57 >> 2 & 1);
      auVar111._8_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar222;
      bVar60 = (bool)(bVar57 >> 3 & 1);
      auVar111._12_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar223;
      bVar60 = (bool)(bVar57 >> 4 & 1);
      auVar111._16_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar236;
      bVar60 = (bool)(bVar57 >> 5 & 1);
      auVar111._20_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar224;
      bVar60 = (bool)(bVar57 >> 6 & 1);
      auVar111._24_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar225;
      auVar111._28_4_ =
           (uint)(bVar57 >> 7) * 0x7f800000 | (uint)!(bool)(bVar57 >> 7) * auVar86._28_4_;
      local_240 = vminps_avx(auVar82,auVar111);
      uVar12 = vcmpps_avx512vl(_local_4c0,local_240,2);
      bVar49 = bVar49 & 0x7f & (byte)uVar12;
      if (bVar49 == 0) goto LAB_01b88086;
      auVar82 = vmaxps_avx512vl(auVar101,auVar92);
      auVar92 = vminps_avx512vl(local_2e0,auVar102);
      auVar39 = ZEXT412(0);
      auVar81 = ZEXT1232(auVar39) << 0x20;
      auVar92 = vmaxps_avx(auVar92,ZEXT1232(auVar39) << 0x20);
      auVar86 = vminps_avx512vl(local_300,auVar102);
      auVar33._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar33._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar33._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar33._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar33._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar33._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar33._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar33._28_4_ = auVar92._28_4_ + 7.0;
      auVar70 = vfmadd213ps_fma(auVar33,local_680,auVar209);
      local_2e0 = ZEXT1632(auVar70);
      auVar92 = vmaxps_avx(auVar86,ZEXT1232(auVar39) << 0x20);
      auVar34._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar34._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar34._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar34._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar34._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar34._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar34._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar34._28_4_ = auVar92._28_4_ + 7.0;
      auVar70 = vfmadd213ps_fma(auVar34,local_680,auVar209);
      local_300 = ZEXT1632(auVar70);
      auVar138._0_4_ = auVar82._0_4_ * auVar82._0_4_;
      auVar138._4_4_ = auVar82._4_4_ * auVar82._4_4_;
      auVar138._8_4_ = auVar82._8_4_ * auVar82._8_4_;
      auVar138._12_4_ = auVar82._12_4_ * auVar82._12_4_;
      auVar138._16_4_ = auVar82._16_4_ * auVar82._16_4_;
      auVar138._20_4_ = auVar82._20_4_ * auVar82._20_4_;
      auVar138._24_4_ = auVar82._24_4_ * auVar82._24_4_;
      auVar138._28_4_ = 0;
      auVar92 = vsubps_avx(auVar98,auVar138);
      auVar82 = vmulps_avx512vl(auVar83,auVar92);
      auVar82 = vsubps_avx512vl(auVar100,auVar82);
      uVar12 = vcmpps_avx512vl(auVar82,ZEXT1232(auVar39) << 0x20,5);
      bVar57 = (byte)uVar12;
      auVar251 = ZEXT3264(local_740);
      auVar254 = ZEXT3264(local_780);
      auVar243 = ZEXT3264(local_7a0);
      if (bVar57 == 0) {
        auVar76 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar77 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar82 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar83 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar234 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar99._8_4_ = 0x7f800000;
        auVar99._0_8_ = 0x7f8000007f800000;
        auVar99._12_4_ = 0x7f800000;
        auVar99._16_4_ = 0x7f800000;
        auVar99._20_4_ = 0x7f800000;
        auVar99._24_4_ = 0x7f800000;
        auVar99._28_4_ = 0x7f800000;
        auVar98._8_4_ = 0xff800000;
        auVar98._0_8_ = 0xff800000ff800000;
        auVar98._12_4_ = 0xff800000;
        auVar98._16_4_ = 0xff800000;
        auVar98._20_4_ = 0xff800000;
        auVar98._24_4_ = 0xff800000;
        auVar98._28_4_ = 0xff800000;
      }
      else {
        auVar68 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
        uVar55 = vcmpps_avx512vl(auVar82,auVar101,5);
        auVar81 = vsqrtps_avx(auVar82);
        auVar162._0_4_ = auVar80._0_4_ + auVar80._0_4_;
        auVar162._4_4_ = auVar80._4_4_ + auVar80._4_4_;
        auVar162._8_4_ = auVar80._8_4_ + auVar80._8_4_;
        auVar162._12_4_ = auVar80._12_4_ + auVar80._12_4_;
        auVar162._16_4_ = auVar80._16_4_ + auVar80._16_4_;
        auVar162._20_4_ = auVar80._20_4_ + auVar80._20_4_;
        auVar162._24_4_ = auVar80._24_4_ + auVar80._24_4_;
        auVar162._28_4_ = auVar80._28_4_ + auVar80._28_4_;
        auVar82 = vrcp14ps_avx512vl(auVar162);
        auVar83 = vfnmadd213ps_avx512vl(auVar162,auVar82,auVar102);
        auVar70 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
        auVar100._8_4_ = 0x80000000;
        auVar100._0_8_ = 0x8000000080000000;
        auVar100._12_4_ = 0x80000000;
        auVar100._16_4_ = 0x80000000;
        auVar100._20_4_ = 0x80000000;
        auVar100._24_4_ = 0x80000000;
        auVar100._28_4_ = 0x80000000;
        auVar82 = vxorps_avx512vl(auVar97,auVar100);
        auVar82 = vsubps_avx(auVar82,auVar81);
        auVar35._4_4_ = auVar82._4_4_ * auVar70._4_4_;
        auVar35._0_4_ = auVar82._0_4_ * auVar70._0_4_;
        auVar35._8_4_ = auVar82._8_4_ * auVar70._8_4_;
        auVar35._12_4_ = auVar82._12_4_ * auVar70._12_4_;
        auVar35._16_4_ = auVar82._16_4_ * 0.0;
        auVar35._20_4_ = auVar82._20_4_ * 0.0;
        auVar35._24_4_ = auVar82._24_4_ * 0.0;
        auVar35._28_4_ = 0x3e000000;
        auVar81 = vsubps_avx512vl(auVar81,auVar97);
        auVar36._4_4_ = auVar81._4_4_ * auVar70._4_4_;
        auVar36._0_4_ = auVar81._0_4_ * auVar70._0_4_;
        auVar36._8_4_ = auVar81._8_4_ * auVar70._8_4_;
        auVar36._12_4_ = auVar81._12_4_ * auVar70._12_4_;
        auVar36._16_4_ = auVar81._16_4_ * 0.0;
        auVar36._20_4_ = auVar81._20_4_ * 0.0;
        auVar36._24_4_ = auVar81._24_4_ * 0.0;
        auVar36._28_4_ = fVar122;
        auVar81 = vfmadd213ps_avx512vl(auVar99,auVar35,auVar76);
        auVar37._4_4_ = auVar79._4_4_ * auVar81._4_4_;
        auVar37._0_4_ = auVar79._0_4_ * auVar81._0_4_;
        auVar37._8_4_ = auVar79._8_4_ * auVar81._8_4_;
        auVar37._12_4_ = auVar79._12_4_ * auVar81._12_4_;
        auVar37._16_4_ = auVar79._16_4_ * auVar81._16_4_;
        auVar37._20_4_ = auVar79._20_4_ * auVar81._20_4_;
        auVar37._24_4_ = auVar79._24_4_ * auVar81._24_4_;
        auVar37._28_4_ = auVar82._28_4_;
        auVar81 = vmulps_avx512vl(local_380,auVar35);
        auVar83 = vmulps_avx512vl(local_7e0,auVar35);
        auVar86 = vmulps_avx512vl(local_3a0,auVar35);
        auVar82 = vfmadd213ps_avx512vl(auVar77,auVar37,auVar84);
        auVar82 = vsubps_avx512vl(auVar81,auVar82);
        auVar81 = vfmadd213ps_avx512vl(auVar78,auVar37,auVar85);
        auVar83 = vsubps_avx512vl(auVar83,auVar81);
        auVar70 = vfmadd213ps_fma(auVar37,auVar89,local_600);
        auVar81 = vsubps_avx(auVar86,ZEXT1632(auVar70));
        auVar234 = auVar81._0_28_;
        auVar76 = vfmadd213ps_avx512vl(auVar99,auVar36,auVar76);
        auVar79 = vmulps_avx512vl(auVar79,auVar76);
        auVar76 = vmulps_avx512vl(local_380,auVar36);
        auVar86 = vmulps_avx512vl(local_7e0,auVar36);
        auVar87 = vmulps_avx512vl(local_3a0,auVar36);
        auVar70 = vfmadd213ps_fma(auVar77,auVar79,auVar84);
        auVar81 = vsubps_avx(auVar76,ZEXT1632(auVar70));
        auVar70 = vfmadd213ps_fma(auVar78,auVar79,auVar85);
        auVar76 = vsubps_avx512vl(auVar86,ZEXT1632(auVar70));
        auVar70 = vfmadd213ps_fma(auVar89,auVar79,local_600);
        auVar77 = vsubps_avx512vl(auVar87,ZEXT1632(auVar70));
        auVar184._8_4_ = 0x7f800000;
        auVar184._0_8_ = 0x7f8000007f800000;
        auVar184._12_4_ = 0x7f800000;
        auVar184._16_4_ = 0x7f800000;
        auVar184._20_4_ = 0x7f800000;
        auVar184._24_4_ = 0x7f800000;
        auVar184._28_4_ = 0x7f800000;
        auVar78 = vblendmps_avx512vl(auVar184,auVar35);
        bVar60 = (bool)((byte)uVar55 & 1);
        auVar99._0_4_ = (uint)bVar60 * auVar78._0_4_ | (uint)!bVar60 * auVar84._0_4_;
        bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar99._4_4_ = (uint)bVar60 * auVar78._4_4_ | (uint)!bVar60 * auVar84._4_4_;
        bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar99._8_4_ = (uint)bVar60 * auVar78._8_4_ | (uint)!bVar60 * auVar84._8_4_;
        bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar99._12_4_ = (uint)bVar60 * auVar78._12_4_ | (uint)!bVar60 * auVar84._12_4_;
        bVar60 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar99._16_4_ = (uint)bVar60 * auVar78._16_4_ | (uint)!bVar60 * auVar84._16_4_;
        bVar60 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar99._20_4_ = (uint)bVar60 * auVar78._20_4_ | (uint)!bVar60 * auVar84._20_4_;
        bVar60 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar99._24_4_ = (uint)bVar60 * auVar78._24_4_ | (uint)!bVar60 * auVar84._24_4_;
        bVar60 = SUB81(uVar55 >> 7,0);
        auVar99._28_4_ = (uint)bVar60 * auVar78._28_4_ | (uint)!bVar60 * auVar84._28_4_;
        auVar185._8_4_ = 0xff800000;
        auVar185._0_8_ = 0xff800000ff800000;
        auVar185._12_4_ = 0xff800000;
        auVar185._16_4_ = 0xff800000;
        auVar185._20_4_ = 0xff800000;
        auVar185._24_4_ = 0xff800000;
        auVar185._28_4_ = 0xff800000;
        auVar78 = vblendmps_avx512vl(auVar185,auVar36);
        bVar60 = (bool)((byte)uVar55 & 1);
        auVar98._0_4_ = (uint)bVar60 * auVar78._0_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar98._4_4_ = (uint)bVar60 * auVar78._4_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar98._8_4_ = (uint)bVar60 * auVar78._8_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar98._12_4_ = (uint)bVar60 * auVar78._12_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar98._16_4_ = (uint)bVar60 * auVar78._16_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar98._20_4_ = (uint)bVar60 * auVar78._20_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar98._24_4_ = (uint)bVar60 * auVar78._24_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = SUB81(uVar55 >> 7,0);
        auVar98._28_4_ = (uint)bVar60 * auVar78._28_4_ | (uint)!bVar60 * -0x800000;
        auVar229._8_4_ = 0x7fffffff;
        auVar229._0_8_ = 0x7fffffff7fffffff;
        auVar229._12_4_ = 0x7fffffff;
        auVar229._16_4_ = 0x7fffffff;
        auVar229._20_4_ = 0x7fffffff;
        auVar229._24_4_ = 0x7fffffff;
        auVar229._28_4_ = 0x7fffffff;
        auVar78 = vandps_avx(auVar229,local_4a0);
        auVar78 = vmaxps_avx(local_280,auVar78);
        auVar24._8_4_ = 0x36000000;
        auVar24._0_8_ = 0x3600000036000000;
        auVar24._12_4_ = 0x36000000;
        auVar24._16_4_ = 0x36000000;
        auVar24._20_4_ = 0x36000000;
        auVar24._24_4_ = 0x36000000;
        auVar24._28_4_ = 0x36000000;
        auVar79 = vmulps_avx512vl(auVar78,auVar24);
        auVar78 = vandps_avx(auVar80,auVar229);
        uVar54 = vcmpps_avx512vl(auVar78,auVar79,1);
        uVar55 = uVar55 & uVar54;
        bVar52 = (byte)uVar55;
        if (bVar52 != 0) {
          uVar54 = vcmpps_avx512vl(auVar92,ZEXT1632(auVar68),2);
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
          auVar237._8_4_ = 0x7f800000;
          auVar237._0_8_ = 0x7f8000007f800000;
          auVar237._12_4_ = 0x7f800000;
          auVar237._16_4_ = 0x7f800000;
          auVar237._20_4_ = 0x7f800000;
          auVar237._24_4_ = 0x7f800000;
          auVar237._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar237,auVar230);
          bVar50 = (byte)uVar54;
          uVar51 = (uint)(bVar50 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar79._0_4_;
          bVar60 = (bool)((byte)(uVar54 >> 1) & 1);
          uVar115 = (uint)bVar60 * auVar92._4_4_ | (uint)!bVar60 * auVar79._4_4_;
          bVar60 = (bool)((byte)(uVar54 >> 2) & 1);
          uVar116 = (uint)bVar60 * auVar92._8_4_ | (uint)!bVar60 * auVar79._8_4_;
          bVar60 = (bool)((byte)(uVar54 >> 3) & 1);
          uVar117 = (uint)bVar60 * auVar92._12_4_ | (uint)!bVar60 * auVar79._12_4_;
          bVar60 = (bool)((byte)(uVar54 >> 4) & 1);
          uVar118 = (uint)bVar60 * auVar92._16_4_ | (uint)!bVar60 * auVar79._16_4_;
          bVar60 = (bool)((byte)(uVar54 >> 5) & 1);
          uVar119 = (uint)bVar60 * auVar92._20_4_ | (uint)!bVar60 * auVar79._20_4_;
          bVar60 = (bool)((byte)(uVar54 >> 6) & 1);
          uVar120 = (uint)bVar60 * auVar92._24_4_ | (uint)!bVar60 * auVar79._24_4_;
          bVar60 = SUB81(uVar54 >> 7,0);
          uVar121 = (uint)bVar60 * auVar92._28_4_ | (uint)!bVar60 * auVar79._28_4_;
          auVar99._0_4_ = (bVar52 & 1) * uVar51 | !(bool)(bVar52 & 1) * auVar99._0_4_;
          bVar60 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar99._4_4_ = bVar60 * uVar115 | !bVar60 * auVar99._4_4_;
          bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar99._8_4_ = bVar60 * uVar116 | !bVar60 * auVar99._8_4_;
          bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar99._12_4_ = bVar60 * uVar117 | !bVar60 * auVar99._12_4_;
          bVar60 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar99._16_4_ = bVar60 * uVar118 | !bVar60 * auVar99._16_4_;
          bVar60 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar99._20_4_ = bVar60 * uVar119 | !bVar60 * auVar99._20_4_;
          bVar60 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar99._24_4_ = bVar60 * uVar120 | !bVar60 * auVar99._24_4_;
          bVar60 = SUB81(uVar55 >> 7,0);
          auVar99._28_4_ = bVar60 * uVar121 | !bVar60 * auVar99._28_4_;
          auVar92 = vblendmps_avx512vl(auVar230,auVar237);
          bVar60 = (bool)((byte)(uVar54 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar54 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar54 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar54 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar54 >> 6) & 1);
          bVar10 = SUB81(uVar54 >> 7,0);
          auVar98._0_4_ =
               (uint)(bVar52 & 1) *
               ((uint)(bVar50 & 1) * auVar92._0_4_ | !(bool)(bVar50 & 1) * uVar51) |
               !(bool)(bVar52 & 1) * auVar98._0_4_;
          bVar4 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar98._4_4_ =
               (uint)bVar4 * ((uint)bVar60 * auVar92._4_4_ | !bVar60 * uVar115) |
               !bVar4 * auVar98._4_4_;
          bVar60 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar98._8_4_ =
               (uint)bVar60 * ((uint)bVar5 * auVar92._8_4_ | !bVar5 * uVar116) |
               !bVar60 * auVar98._8_4_;
          bVar60 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar98._12_4_ =
               (uint)bVar60 * ((uint)bVar6 * auVar92._12_4_ | !bVar6 * uVar117) |
               !bVar60 * auVar98._12_4_;
          bVar60 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar98._16_4_ =
               (uint)bVar60 * ((uint)bVar7 * auVar92._16_4_ | !bVar7 * uVar118) |
               !bVar60 * auVar98._16_4_;
          bVar60 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar98._20_4_ =
               (uint)bVar60 * ((uint)bVar8 * auVar92._20_4_ | !bVar8 * uVar119) |
               !bVar60 * auVar98._20_4_;
          bVar60 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar98._24_4_ =
               (uint)bVar60 * ((uint)bVar9 * auVar92._24_4_ | !bVar9 * uVar120) |
               !bVar60 * auVar98._24_4_;
          bVar60 = SUB81(uVar55 >> 7,0);
          auVar98._28_4_ =
               (uint)bVar60 * ((uint)bVar10 * auVar92._28_4_ | !bVar10 * uVar121) |
               !bVar60 * auVar98._28_4_;
          bVar57 = (~bVar52 | bVar50) & bVar57;
        }
      }
      auVar255 = ZEXT3264(local_8a0);
      auVar253 = ZEXT3264(local_800);
      auVar250 = ZEXT3264(local_880);
      auVar249 = ZEXT3264(local_860);
      auVar248 = ZEXT3264(local_7e0);
      auVar245 = ZEXT3264(local_840);
      auVar244 = ZEXT3264(local_820);
      auVar92 = vmulps_avx512vl(local_3a0,auVar77);
      auVar92 = vfmadd231ps_avx512vl(auVar92,local_7e0,auVar76);
      auVar70 = vfmadd231ps_fma(auVar92,local_380,auVar81);
      _local_1c0 = _local_4c0;
      local_1a0 = vminps_avx(local_240,auVar99);
      auVar220._8_4_ = 0x7fffffff;
      auVar220._0_8_ = 0x7fffffff7fffffff;
      auVar220._12_4_ = 0x7fffffff;
      auVar220._16_4_ = 0x7fffffff;
      auVar220._20_4_ = 0x7fffffff;
      auVar220._24_4_ = 0x7fffffff;
      auVar220._28_4_ = 0x7fffffff;
      auVar92 = vandps_avx(ZEXT1632(auVar70),auVar220);
      _local_260 = vmaxps_avx(_local_4c0,auVar98);
      auVar186._8_4_ = 0x3e99999a;
      auVar186._0_8_ = 0x3e99999a3e99999a;
      auVar186._12_4_ = 0x3e99999a;
      auVar186._16_4_ = 0x3e99999a;
      auVar186._20_4_ = 0x3e99999a;
      auVar186._24_4_ = 0x3e99999a;
      auVar186._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar92,auVar186,1);
      local_8ac = (undefined4)uVar12;
      uVar12 = vcmpps_avx512vl(_local_4c0,local_1a0,2);
      bVar52 = (byte)uVar12 & bVar49;
      _local_340 = _local_260;
      uVar13 = vcmpps_avx512vl(_local_260,local_240,2);
      auVar252 = ZEXT3264(local_720);
      auVar246 = ZEXT3264(local_620);
      auVar247 = ZEXT3264(local_760);
      if ((bVar49 & ((byte)uVar13 | (byte)uVar12)) == 0) {
        auVar197 = ZEXT3264(_DAT_02020f20);
        auVar233 = ZEXT3264(local_6a0);
        auVar235 = ZEXT3264(local_7c0);
        auVar188 = ZEXT3264(local_560);
        auVar204 = ZEXT3264(local_640);
        auVar145 = ZEXT1664(local_6f0);
      }
      else {
        auVar38._4_4_ = auVar234._4_4_ * local_3a0._4_4_;
        auVar38._0_4_ = auVar234._0_4_ * local_3a0._0_4_;
        auVar38._8_4_ = auVar234._8_4_ * local_3a0._8_4_;
        auVar38._12_4_ = auVar234._12_4_ * local_3a0._12_4_;
        auVar38._16_4_ = auVar234._16_4_ * local_3a0._16_4_;
        auVar38._20_4_ = auVar234._20_4_ * local_3a0._20_4_;
        auVar38._24_4_ = auVar234._24_4_ * local_3a0._24_4_;
        auVar38._28_4_ = 0x3e99999a;
        auVar92 = vfmadd213ps_avx512vl(auVar83,local_7e0,auVar38);
        auVar70 = vfmadd213ps_fma(auVar82,local_380,auVar92);
        auVar92 = vandps_avx(ZEXT1632(auVar70),auVar220);
        uVar12 = vcmpps_avx512vl(auVar92,auVar186,1);
        local_8b4 = (uint)(byte)~bVar57;
        bVar57 = (byte)uVar12 | ~bVar57;
        auVar139._8_4_ = 2;
        auVar139._0_8_ = 0x200000002;
        auVar139._12_4_ = 2;
        auVar139._16_4_ = 2;
        auVar139._20_4_ = 2;
        auVar139._24_4_ = 2;
        auVar139._28_4_ = 2;
        auVar25._8_4_ = 3;
        auVar25._0_8_ = 0x300000003;
        auVar25._12_4_ = 3;
        auVar25._16_4_ = 3;
        auVar25._20_4_ = 3;
        auVar25._24_4_ = 3;
        auVar25._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar139,auVar25);
        local_220._0_4_ = (uint)(bVar57 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
        bVar60 = (bool)(bVar57 >> 1 & 1);
        local_220._4_4_ = (uint)bVar60 * auVar92._4_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 2 & 1);
        local_220._8_4_ = (uint)bVar60 * auVar92._8_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 3 & 1);
        local_220._12_4_ = (uint)bVar60 * auVar92._12_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 4 & 1);
        local_220._16_4_ = (uint)bVar60 * auVar92._16_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 5 & 1);
        local_220._20_4_ = (uint)bVar60 * auVar92._20_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 6 & 1);
        local_220._24_4_ = (uint)bVar60 * auVar92._24_4_ | (uint)!bVar60 * 2;
        local_220._28_4_ = (uint)(bVar57 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2;
        local_2a0 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_2a0,local_220,5);
        local_8b0 = (uint)bVar52;
        bVar52 = (byte)uVar12 & bVar52;
        if (bVar52 == 0) {
          auVar231._8_4_ = 0x7fffffff;
          auVar231._0_8_ = 0x7fffffff7fffffff;
          auVar231._12_4_ = 0x7fffffff;
          auVar235 = ZEXT3264(local_7c0);
        }
        else {
          auVar68 = vminps_avx(local_4e0._0_16_,local_520._0_16_);
          auVar70 = vmaxps_avx(local_4e0._0_16_,local_520._0_16_);
          auVar63 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar69 = vminps_avx(auVar68,auVar63);
          auVar68 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar63 = vmaxps_avx(auVar70,auVar68);
          auVar169._8_4_ = 0x7fffffff;
          auVar169._0_8_ = 0x7fffffff7fffffff;
          auVar169._12_4_ = 0x7fffffff;
          auVar70 = vandps_avx(auVar69,auVar169);
          auVar68 = vandps_avx(auVar63,auVar169);
          auVar70 = vmaxps_avx(auVar70,auVar68);
          auVar68 = vmovshdup_avx(auVar70);
          auVar68 = vmaxss_avx(auVar68,auVar70);
          auVar70 = vshufpd_avx(auVar70,auVar70,1);
          auVar70 = vmaxss_avx(auVar70,auVar68);
          fVar211 = auVar70._0_4_ * 1.9073486e-06;
          local_5d0 = vshufps_avx(auVar63,auVar63,0xff);
          local_320 = (float)local_4c0._0_4_ + (float)local_360._0_4_;
          fStack_31c = (float)local_4c0._4_4_ + (float)local_360._4_4_;
          fStack_318 = fStack_4b8 + fStack_358;
          fStack_314 = fStack_4b4 + fStack_354;
          fStack_310 = fStack_4b0 + fStack_350;
          fStack_30c = fStack_4ac + fStack_34c;
          fStack_308 = fStack_4a8 + fStack_348;
          fStack_304 = fStack_4a4 + fStack_344;
          do {
            auVar140._8_4_ = 0x7f800000;
            auVar140._0_8_ = 0x7f8000007f800000;
            auVar140._12_4_ = 0x7f800000;
            auVar140._16_4_ = 0x7f800000;
            auVar140._20_4_ = 0x7f800000;
            auVar140._24_4_ = 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar92 = vblendmps_avx512vl(auVar140,_local_4c0);
            auVar112._0_4_ =
                 (uint)(bVar52 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar52 >> 1 & 1);
            auVar112._4_4_ = (uint)bVar60 * auVar92._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar52 >> 2 & 1);
            auVar112._8_4_ = (uint)bVar60 * auVar92._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar52 >> 3 & 1);
            auVar112._12_4_ = (uint)bVar60 * auVar92._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar52 >> 4 & 1);
            auVar112._16_4_ = (uint)bVar60 * auVar92._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar52 >> 5 & 1);
            auVar112._20_4_ = (uint)bVar60 * auVar92._20_4_ | (uint)!bVar60 * 0x7f800000;
            auVar112._24_4_ =
                 (uint)(bVar52 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar52 >> 6) * 0x7f800000;
            auVar112._28_4_ = 0x7f800000;
            auVar92 = vshufps_avx(auVar112,auVar112,0xb1);
            auVar92 = vminps_avx(auVar112,auVar92);
            auVar76 = vshufpd_avx(auVar92,auVar92,5);
            auVar92 = vminps_avx(auVar92,auVar76);
            auVar76 = vpermpd_avx2(auVar92,0x4e);
            auVar92 = vminps_avx(auVar92,auVar76);
            uVar12 = vcmpps_avx512vl(auVar112,auVar92,0);
            bVar50 = (byte)uVar12 & bVar52;
            bVar57 = bVar52;
            if (bVar50 != 0) {
              bVar57 = bVar50;
            }
            iVar15 = 0;
            for (uVar51 = (uint)bVar57; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar57 = '\x01' << ((byte)iVar15 & 0x1f);
            fVar221 = *(float *)(local_2e0 + (uint)(iVar15 << 2));
            fVar222 = *(float *)(local_1c0 + (uint)(iVar15 << 2));
            fVar223 = local_8a8;
            if ((float)local_660._0_4_ < 0.0) {
              fVar223 = sqrtf((float)local_660._0_4_);
            }
            bVar50 = ~bVar57;
            lVar58 = 5;
            do {
              auVar126._4_4_ = fVar222;
              auVar126._0_4_ = fVar222;
              auVar126._8_4_ = fVar222;
              auVar126._12_4_ = fVar222;
              auVar68 = vfmadd132ps_fma(auVar126,ZEXT816(0) << 0x40,local_650);
              fVar236 = 1.0 - fVar221;
              auVar170._0_4_ = local_520._0_4_ * fVar221;
              auVar170._4_4_ = local_520._4_4_ * fVar221;
              auVar170._8_4_ = local_520._8_4_ * fVar221;
              auVar170._12_4_ = local_520._12_4_ * fVar221;
              local_570 = ZEXT416((uint)fVar236);
              auVar192._4_4_ = fVar236;
              auVar192._0_4_ = fVar236;
              auVar192._8_4_ = fVar236;
              auVar192._12_4_ = fVar236;
              auVar70 = vfmadd231ps_fma(auVar170,auVar192,local_4e0._0_16_);
              auVar200._0_4_ = local_500._0_4_ * fVar221;
              auVar200._4_4_ = local_500._4_4_ * fVar221;
              auVar200._8_4_ = local_500._8_4_ * fVar221;
              auVar200._12_4_ = local_500._12_4_ * fVar221;
              auVar63 = vfmadd231ps_fma(auVar200,auVar192,local_520._0_16_);
              auVar207._0_4_ = fVar221 * (float)local_540._0_4_;
              auVar207._4_4_ = fVar221 * (float)local_540._4_4_;
              auVar207._8_4_ = fVar221 * fStack_538;
              auVar207._12_4_ = fVar221 * fStack_534;
              auVar69 = vfmadd231ps_fma(auVar207,auVar192,local_500._0_16_);
              auVar216._0_4_ = fVar221 * auVar63._0_4_;
              auVar216._4_4_ = fVar221 * auVar63._4_4_;
              auVar216._8_4_ = fVar221 * auVar63._8_4_;
              auVar216._12_4_ = fVar221 * auVar63._12_4_;
              auVar70 = vfmadd231ps_fma(auVar216,auVar192,auVar70);
              auVar171._0_4_ = fVar221 * auVar69._0_4_;
              auVar171._4_4_ = fVar221 * auVar69._4_4_;
              auVar171._8_4_ = fVar221 * auVar69._8_4_;
              auVar171._12_4_ = fVar221 * auVar69._12_4_;
              auVar63 = vfmadd231ps_fma(auVar171,auVar192,auVar63);
              auVar201._0_4_ = fVar221 * auVar63._0_4_;
              auVar201._4_4_ = fVar221 * auVar63._4_4_;
              auVar201._8_4_ = fVar221 * auVar63._8_4_;
              auVar201._12_4_ = fVar221 * auVar63._12_4_;
              auVar69 = vfmadd231ps_fma(auVar201,auVar70,auVar192);
              auVar70 = vsubps_avx(auVar63,auVar70);
              auVar17._8_4_ = 0x40400000;
              auVar17._0_8_ = 0x4040000040400000;
              auVar17._12_4_ = 0x40400000;
              auVar63 = vmulps_avx512vl(auVar70,auVar17);
              local_4a0._0_16_ = auVar69;
              auVar70 = vsubps_avx(auVar68,auVar69);
              local_680._0_16_ = auVar70;
              auVar70 = vdpps_avx(auVar70,auVar70,0x7f);
              local_600._0_16_ = auVar70;
              local_920 = ZEXT416((uint)fVar221);
              if (auVar70._0_4_ < 0.0) {
                auVar188._0_4_ = sqrtf(auVar70._0_4_);
                auVar188._4_60_ = extraout_var;
                auVar70 = auVar188._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
              }
              local_580 = vdpps_avx(auVar63,auVar63,0x7f);
              fVar236 = local_580._0_4_;
              auVar172._4_12_ = ZEXT812(0) << 0x20;
              auVar172._0_4_ = fVar236;
              auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
              fVar122 = auVar68._0_4_;
              local_590 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_580,auVar18);
              auVar68 = vfnmadd213ss_fma(local_590,local_580,ZEXT416(0x40000000));
              uVar51 = auVar70._0_4_;
              if (fVar236 < auVar69._0_4_) {
                auVar197._0_4_ = sqrtf(fVar236);
                auVar197._4_60_ = extraout_var_00;
                auVar70 = ZEXT416(uVar51);
                auVar69 = auVar197._0_16_;
              }
              else {
                auVar69 = vsqrtss_avx512f(local_580,local_580);
              }
              fVar236 = fVar122 * 1.5 + fVar236 * -0.5 * fVar122 * fVar122 * fVar122;
              auVar127._0_4_ = auVar63._0_4_ * fVar236;
              auVar127._4_4_ = auVar63._4_4_ * fVar236;
              auVar127._8_4_ = auVar63._8_4_ * fVar236;
              auVar127._12_4_ = auVar63._12_4_ * fVar236;
              auVar71 = vdpps_avx(local_680._0_16_,auVar127,0x7f);
              auVar72 = vaddss_avx512f(auVar70,ZEXT416(0x3f800000));
              auVar128._0_4_ = auVar71._0_4_ * auVar71._0_4_;
              auVar128._4_4_ = auVar71._4_4_ * auVar71._4_4_;
              auVar128._8_4_ = auVar71._8_4_ * auVar71._8_4_;
              auVar128._12_4_ = auVar71._12_4_ * auVar71._12_4_;
              auVar64 = vsubps_avx(local_600._0_16_,auVar128);
              fVar122 = auVar64._0_4_;
              auVar150._4_12_ = ZEXT812(0) << 0x20;
              auVar150._0_4_ = fVar122;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar150);
              auVar65 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              uVar61 = fVar122 == 0.0;
              uVar59 = fVar122 < 0.0;
              if ((bool)uVar59) {
                local_5b0 = fVar236;
                fStack_5ac = fVar236;
                fStack_5a8 = fVar236;
                fStack_5a4 = fVar236;
                local_5a0 = auVar73;
                fVar224 = sqrtf(fVar122);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar70 = ZEXT416(uVar51);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar73 = local_5a0;
                fVar236 = local_5b0;
                fVar225 = fStack_5ac;
                fVar226 = fStack_5a8;
                fVar239 = fStack_5a4;
              }
              else {
                auVar64 = vsqrtss_avx(auVar64,auVar64);
                fVar224 = auVar64._0_4_;
                fVar225 = fVar236;
                fVar226 = fVar236;
                fVar239 = fVar236;
              }
              in_ZMM31 = ZEXT1664(auVar73);
              auVar231._8_4_ = 0x7fffffff;
              auVar231._0_8_ = 0x7fffffff7fffffff;
              auVar231._12_4_ = 0x7fffffff;
              auVar248 = ZEXT3264(local_7e0);
              auVar235 = ZEXT3264(local_7c0);
              auVar252 = ZEXT3264(local_720);
              auVar251 = ZEXT3264(local_740);
              auVar254 = ZEXT3264(local_780);
              auVar64 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_570);
              fVar147 = auVar64._0_4_ * 6.0;
              fVar11 = fVar221 * 6.0;
              auVar173._0_4_ = fVar11 * (float)local_540._0_4_;
              auVar173._4_4_ = fVar11 * (float)local_540._4_4_;
              auVar173._8_4_ = fVar11 * fStack_538;
              auVar173._12_4_ = fVar11 * fStack_534;
              auVar151._4_4_ = fVar147;
              auVar151._0_4_ = fVar147;
              auVar151._8_4_ = fVar147;
              auVar151._12_4_ = fVar147;
              auVar64 = vfmadd132ps_fma(auVar151,auVar173,local_500._0_16_);
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_570,local_920);
              fVar147 = auVar75._0_4_ * 6.0;
              auVar174._4_4_ = fVar147;
              auVar174._0_4_ = fVar147;
              auVar174._8_4_ = fVar147;
              auVar174._12_4_ = fVar147;
              auVar64 = vfmadd132ps_fma(auVar174,auVar64,local_520._0_16_);
              fVar147 = local_570._0_4_ * 6.0;
              auVar152._4_4_ = fVar147;
              auVar152._0_4_ = fVar147;
              auVar152._8_4_ = fVar147;
              auVar152._12_4_ = fVar147;
              auVar64 = vfmadd132ps_fma(auVar152,auVar64,local_4e0._0_16_);
              auVar175._0_4_ = auVar64._0_4_ * (float)local_580._0_4_;
              auVar175._4_4_ = auVar64._4_4_ * (float)local_580._0_4_;
              auVar175._8_4_ = auVar64._8_4_ * (float)local_580._0_4_;
              auVar175._12_4_ = auVar64._12_4_ * (float)local_580._0_4_;
              auVar64 = vdpps_avx(auVar63,auVar64,0x7f);
              fVar147 = auVar64._0_4_;
              auVar153._0_4_ = auVar63._0_4_ * fVar147;
              auVar153._4_4_ = auVar63._4_4_ * fVar147;
              auVar153._8_4_ = auVar63._8_4_ * fVar147;
              auVar153._12_4_ = auVar63._12_4_ * fVar147;
              auVar75 = vsubps_avx(auVar175,auVar153);
              fVar147 = auVar68._0_4_ * (float)local_590._0_4_;
              auVar64 = vmaxss_avx(ZEXT416((uint)fVar211),
                                   ZEXT416((uint)(fVar222 * fVar223 * 1.9073486e-06)));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(auVar63,auVar19);
              auVar176._0_4_ = fVar236 * auVar75._0_4_ * fVar147;
              auVar176._4_4_ = fVar225 * auVar75._4_4_ * fVar147;
              auVar176._8_4_ = fVar226 * auVar75._8_4_ * fVar147;
              auVar176._12_4_ = fVar239 * auVar75._12_4_ * fVar147;
              auVar68 = vdpps_avx(auVar74,auVar127,0x7f);
              auVar75 = vdivss_avx512f(ZEXT416((uint)fVar211),auVar69);
              auVar69 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar211),auVar64);
              auVar70 = vdpps_avx(local_680._0_16_,auVar176,0x7f);
              vfmadd213ss_avx512f(auVar72,auVar75,auVar69);
              fVar236 = auVar68._0_4_ + auVar70._0_4_;
              auVar70 = vdpps_avx(local_650,auVar127,0x7f);
              auVar68 = vdpps_avx(local_680._0_16_,auVar74,0x7f);
              auVar69 = vmulss_avx512f(auVar73,ZEXT416((uint)(fVar122 * -0.5)));
              auVar73 = vmulss_avx512f(auVar73,auVar73);
              fVar122 = auVar69._0_4_ * auVar73._0_4_ + auVar65._0_4_;
              auVar69 = vdpps_avx(local_680._0_16_,local_650,0x7f);
              auVar73 = vfnmadd231ss_avx512f(auVar68,auVar71,ZEXT416((uint)fVar236));
              auVar72 = vfnmadd231ss_avx512f(auVar69,auVar71,auVar70);
              auVar68 = vpermilps_avx(local_4a0._0_16_,0xff);
              fVar224 = fVar224 - auVar68._0_4_;
              auVar68 = vshufps_avx(auVar63,auVar63,0xff);
              auVar69 = vfmsub213ss_fma(auVar73,ZEXT416((uint)fVar122),auVar68);
              fVar122 = auVar72._0_4_ * fVar122;
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar69._0_4_)),
                                        ZEXT416((uint)fVar236),ZEXT416((uint)fVar122));
              fVar225 = auVar73._0_4_;
              auVar217._0_4_ = fVar122 / fVar225;
              auVar217._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar193._0_4_ = auVar69._0_4_ / fVar225;
              auVar193._4_12_ = auVar69._4_12_;
              auVar69 = vmulss_avx512f(auVar71,auVar217);
              auVar73 = vmulss_avx512f(auVar71,auVar193);
              fVar221 = fVar221 - (auVar69._0_4_ - fVar224 * (auVar70._0_4_ / fVar225));
              fVar222 = fVar222 - (fVar224 * (fVar236 / fVar225) - auVar73._0_4_);
              auVar70 = vandps_avx512vl(auVar71,auVar231);
              auVar70 = vucomiss_avx512f(auVar70);
              bVar60 = true;
              if (!(bool)uVar59 && !(bool)uVar61) {
                auVar70 = vaddss_avx512f(auVar64,auVar70);
                auVar69 = vfmadd231ss_fma(auVar70,local_5d0,ZEXT416(0x36000000));
                auVar70 = vandps_avx(auVar231,ZEXT416((uint)fVar224));
                if (auVar70._0_4_ < auVar69._0_4_) {
                  fVar222 = fVar222 + (float)local_5c0._0_4_;
                  if ((((fVar146 <= fVar222) &&
                       (fVar236 = *(float *)(ray + k * 4 + 0x80), fVar222 <= fVar236)) &&
                      (0.0 <= fVar221)) && (fVar221 <= 1.0)) {
                    auVar40._12_4_ = 0;
                    auVar40._0_12_ = ZEXT812(0);
                    auVar70 = vrsqrt14ss_avx512f(auVar40 << 0x20,ZEXT416((uint)local_600._0_4_));
                    fVar122 = auVar70._0_4_;
                    pGVar2 = (context->scene->geometries).items[local_8c8].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar57 = true;
                      }
                      else {
                        fVar122 = fVar122 * 1.5 +
                                  (float)local_600._0_4_ * -0.5 * fVar122 * fVar122 * fVar122;
                        auVar154._0_4_ = local_680._0_4_ * fVar122;
                        auVar154._4_4_ = local_680._4_4_ * fVar122;
                        auVar154._8_4_ = local_680._8_4_ * fVar122;
                        auVar154._12_4_ = local_680._12_4_ * fVar122;
                        auVar69 = vfmadd213ps_fma(auVar68,auVar154,auVar63);
                        auVar70 = vshufps_avx(auVar154,auVar154,0xc9);
                        auVar68 = vshufps_avx(auVar63,auVar63,0xc9);
                        auVar155._0_4_ = auVar154._0_4_ * auVar68._0_4_;
                        auVar155._4_4_ = auVar154._4_4_ * auVar68._4_4_;
                        auVar155._8_4_ = auVar154._8_4_ * auVar68._8_4_;
                        auVar155._12_4_ = auVar154._12_4_ * auVar68._12_4_;
                        auVar63 = vfmsub231ps_fma(auVar155,auVar63,auVar70);
                        auVar70 = vshufps_avx(auVar63,auVar63,0xc9);
                        auVar68 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar63 = vshufps_avx(auVar63,auVar63,0xd2);
                        auVar129._0_4_ = auVar69._0_4_ * auVar63._0_4_;
                        auVar129._4_4_ = auVar69._4_4_ * auVar63._4_4_;
                        auVar129._8_4_ = auVar69._8_4_ * auVar63._8_4_;
                        auVar129._12_4_ = auVar69._12_4_ * auVar63._12_4_;
                        auVar70 = vfmsub231ps_fma(auVar129,auVar70,auVar68);
                        local_440 = (RTCHitN  [16])vshufps_avx(auVar70,auVar70,0x55);
                        auStack_430 = vshufps_avx(auVar70,auVar70,0xaa);
                        local_420 = auVar70._0_4_;
                        uStack_41c = local_420;
                        uStack_418 = local_420;
                        uStack_414 = local_420;
                        local_410 = fVar221;
                        fStack_40c = fVar221;
                        fStack_408 = fVar221;
                        fStack_404 = fVar221;
                        local_400 = ZEXT416(0) << 0x20;
                        local_3f0 = local_450._0_8_;
                        uStack_3e8 = local_450._8_8_;
                        local_3e0 = local_460;
                        vpcmpeqd_avx2(ZEXT1632(local_460),ZEXT1632(local_460));
                        uStack_3cc = context->user->instID[0];
                        local_3d0 = uStack_3cc;
                        uStack_3c8 = uStack_3cc;
                        uStack_3c4 = uStack_3cc;
                        uStack_3c0 = context->user->instPrimID[0];
                        uStack_3bc = uStack_3c0;
                        uStack_3b8 = uStack_3c0;
                        uStack_3b4 = uStack_3c0;
                        *(float *)(ray + k * 4 + 0x80) = fVar222;
                        local_8e0 = local_470._0_8_;
                        uStack_8d8 = local_470._8_8_;
                        local_6d0.valid = (int *)&local_8e0;
                        local_6d0.geometryUserPtr = pGVar2->userPtr;
                        local_6d0.context = context->user;
                        local_6d0.hit = local_440;
                        local_6d0.N = 4;
                        local_6d0.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar2->occlusionFilterN)(&local_6d0);
                          auVar254 = ZEXT3264(local_780);
                          auVar251 = ZEXT3264(local_740);
                          auVar252 = ZEXT3264(local_720);
                          auVar235 = ZEXT3264(local_7c0);
                          auVar248 = ZEXT3264(local_7e0);
                          auVar231._8_4_ = 0x7fffffff;
                          auVar231._0_8_ = 0x7fffffff7fffffff;
                          auVar231._12_4_ = 0x7fffffff;
                        }
                        auVar42._8_8_ = uStack_8d8;
                        auVar42._0_8_ = local_8e0;
                        uVar55 = vptestmd_avx512vl(auVar42,auVar42);
                        if ((uVar55 & 0xf) == 0) {
                          bVar57 = false;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var3)(&local_6d0);
                            auVar254 = ZEXT3264(local_780);
                            auVar251 = ZEXT3264(local_740);
                            auVar252 = ZEXT3264(local_720);
                            auVar235 = ZEXT3264(local_7c0);
                            auVar248 = ZEXT3264(local_7e0);
                            auVar231._8_4_ = 0x7fffffff;
                            auVar231._0_8_ = 0x7fffffff7fffffff;
                            auVar231._12_4_ = 0x7fffffff;
                          }
                          auVar43._8_8_ = uStack_8d8;
                          auVar43._0_8_ = local_8e0;
                          uVar55 = vptestmd_avx512vl(auVar43,auVar43);
                          uVar55 = uVar55 & 0xf;
                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar60 = (bool)((byte)uVar55 & 1);
                          bVar4 = (bool)((byte)(uVar55 >> 1) & 1);
                          bVar5 = (bool)((byte)(uVar55 >> 2) & 1);
                          bVar6 = SUB81(uVar55 >> 3,0);
                          *(uint *)(local_6d0.ray + 0x80) =
                               (uint)bVar60 * auVar70._0_4_ |
                               (uint)!bVar60 * *(int *)(local_6d0.ray + 0x80);
                          *(uint *)(local_6d0.ray + 0x84) =
                               (uint)bVar4 * auVar70._4_4_ |
                               (uint)!bVar4 * *(int *)(local_6d0.ray + 0x84);
                          *(uint *)(local_6d0.ray + 0x88) =
                               (uint)bVar5 * auVar70._8_4_ |
                               (uint)!bVar5 * *(int *)(local_6d0.ray + 0x88);
                          *(uint *)(local_6d0.ray + 0x8c) =
                               (uint)bVar6 * auVar70._12_4_ |
                               (uint)!bVar6 * *(int *)(local_6d0.ray + 0x8c);
                          bVar57 = (byte)uVar55 != 0;
                        }
                        if ((bool)bVar57 == false) {
                          *(float *)(ray + k * 4 + 0x80) = fVar236;
                        }
                      }
                      bVar60 = false;
                      goto LAB_01b88979;
                    }
                  }
                  bVar60 = false;
                  bVar57 = 0;
                }
              }
LAB_01b88979:
              if (!bVar60) goto LAB_01b88d72;
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
            bVar57 = 0;
LAB_01b88d72:
            bVar56 = bVar56 | bVar57 & 1;
            auVar46._4_4_ = fStack_31c;
            auVar46._0_4_ = local_320;
            auVar46._8_4_ = fStack_318;
            auVar46._12_4_ = fStack_314;
            auVar46._16_4_ = fStack_310;
            auVar46._20_4_ = fStack_30c;
            auVar46._24_4_ = fStack_308;
            auVar46._28_4_ = fStack_304;
            uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar26._4_4_ = uVar210;
            auVar26._0_4_ = uVar210;
            auVar26._8_4_ = uVar210;
            auVar26._12_4_ = uVar210;
            auVar26._16_4_ = uVar210;
            auVar26._20_4_ = uVar210;
            auVar26._24_4_ = uVar210;
            auVar26._28_4_ = uVar210;
            uVar12 = vcmpps_avx512vl(auVar46,auVar26,2);
            bVar52 = bVar50 & bVar52 & (byte)uVar12;
          } while (bVar52 != 0);
        }
        auVar141._0_4_ = (float)local_360._0_4_ + (float)local_340._0_4_;
        auVar141._4_4_ = (float)local_360._4_4_ + (float)local_340._4_4_;
        auVar141._8_4_ = fStack_358 + fStack_338;
        auVar141._12_4_ = fStack_354 + fStack_334;
        auVar141._16_4_ = fStack_350 + fStack_330;
        auVar141._20_4_ = fStack_34c + fStack_32c;
        auVar141._24_4_ = fStack_348 + fStack_328;
        auVar141._28_4_ = fStack_344 + fStack_324;
        uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar27._4_4_ = uVar210;
        auVar27._0_4_ = uVar210;
        auVar27._8_4_ = uVar210;
        auVar27._12_4_ = uVar210;
        auVar27._16_4_ = uVar210;
        auVar27._20_4_ = uVar210;
        auVar27._24_4_ = uVar210;
        auVar27._28_4_ = uVar210;
        uVar12 = vcmpps_avx512vl(auVar141,auVar27,2);
        bVar57 = (byte)local_8ac | (byte)local_8b4;
        bVar49 = (byte)uVar13 & bVar49 & (byte)uVar12;
        auVar142._8_4_ = 2;
        auVar142._0_8_ = 0x200000002;
        auVar142._12_4_ = 2;
        auVar142._16_4_ = 2;
        auVar142._20_4_ = 2;
        auVar142._24_4_ = 2;
        auVar142._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar142,auVar28);
        local_340._0_4_ = (uint)(bVar57 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
        bVar60 = (bool)(bVar57 >> 1 & 1);
        local_340._4_4_ = (uint)bVar60 * auVar92._4_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 2 & 1);
        fStack_338 = (float)((uint)bVar60 * auVar92._8_4_ | (uint)!bVar60 * 2);
        bVar60 = (bool)(bVar57 >> 3 & 1);
        fStack_334 = (float)((uint)bVar60 * auVar92._12_4_ | (uint)!bVar60 * 2);
        bVar60 = (bool)(bVar57 >> 4 & 1);
        fStack_330 = (float)((uint)bVar60 * auVar92._16_4_ | (uint)!bVar60 * 2);
        bVar60 = (bool)(bVar57 >> 5 & 1);
        fStack_32c = (float)((uint)bVar60 * auVar92._20_4_ | (uint)!bVar60 * 2);
        bVar60 = (bool)(bVar57 >> 6 & 1);
        fStack_328 = (float)((uint)bVar60 * auVar92._24_4_ | (uint)!bVar60 * 2);
        fStack_324 = (float)((uint)(bVar57 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2);
        uVar12 = vpcmpd_avx512vl(_local_340,local_2a0,2);
        bVar57 = (byte)uVar12 & bVar49;
        if (bVar57 == 0) {
          auVar233 = ZEXT3264(local_6a0);
          auVar204 = ZEXT3264(local_640);
          auVar243 = ZEXT3264(local_7a0);
          auVar253 = ZEXT3264(local_800);
          auVar245 = ZEXT3264(local_840);
          auVar244 = ZEXT3264(local_820);
          auVar249 = ZEXT3264(local_860);
          auVar250 = ZEXT3264(local_880);
          auVar255 = ZEXT3264(local_8a0);
          auVar247 = ZEXT3264(local_760);
          auVar246 = ZEXT3264(local_620);
        }
        else {
          auVar68 = vminps_avx(local_4e0._0_16_,local_520._0_16_);
          auVar70 = vmaxps_avx(local_4e0._0_16_,local_520._0_16_);
          auVar63 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar69 = vminps_avx(auVar68,auVar63);
          auVar68 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar63 = vmaxps_avx(auVar70,auVar68);
          auVar70 = vandps_avx(auVar231,auVar69);
          auVar68 = vandps_avx(auVar231,auVar63);
          auVar70 = vmaxps_avx(auVar70,auVar68);
          auVar68 = vmovshdup_avx(auVar70);
          auVar68 = vmaxss_avx(auVar68,auVar70);
          auVar70 = vshufpd_avx(auVar70,auVar70,1);
          auVar70 = vmaxss_avx(auVar70,auVar68);
          fVar211 = auVar70._0_4_ * 1.9073486e-06;
          local_5d0 = vshufps_avx(auVar63,auVar63,0xff);
          _local_4c0 = _local_260;
          local_320 = (float)local_360._0_4_ + (float)local_260._0_4_;
          fStack_31c = (float)local_360._4_4_ + (float)local_260._4_4_;
          fStack_318 = fStack_358 + fStack_258;
          fStack_314 = fStack_354 + fStack_254;
          fStack_310 = fStack_350 + fStack_250;
          fStack_30c = fStack_34c + fStack_24c;
          fStack_308 = fStack_348 + fStack_248;
          fStack_304 = fStack_344 + fStack_244;
          do {
            auVar143._8_4_ = 0x7f800000;
            auVar143._0_8_ = 0x7f8000007f800000;
            auVar143._12_4_ = 0x7f800000;
            auVar143._16_4_ = 0x7f800000;
            auVar143._20_4_ = 0x7f800000;
            auVar143._24_4_ = 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar92 = vblendmps_avx512vl(auVar143,_local_4c0);
            auVar113._0_4_ =
                 (uint)(bVar57 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 1 & 1);
            auVar113._4_4_ = (uint)bVar60 * auVar92._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 2 & 1);
            auVar113._8_4_ = (uint)bVar60 * auVar92._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 3 & 1);
            auVar113._12_4_ = (uint)bVar60 * auVar92._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 4 & 1);
            auVar113._16_4_ = (uint)bVar60 * auVar92._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 5 & 1);
            auVar113._20_4_ = (uint)bVar60 * auVar92._20_4_ | (uint)!bVar60 * 0x7f800000;
            auVar113._24_4_ =
                 (uint)(bVar57 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar57 >> 6) * 0x7f800000;
            auVar113._28_4_ = 0x7f800000;
            auVar92 = vshufps_avx(auVar113,auVar113,0xb1);
            auVar92 = vminps_avx(auVar113,auVar92);
            auVar76 = vshufpd_avx(auVar92,auVar92,5);
            auVar92 = vminps_avx(auVar92,auVar76);
            auVar76 = vpermpd_avx2(auVar92,0x4e);
            auVar92 = vminps_avx(auVar92,auVar76);
            uVar12 = vcmpps_avx512vl(auVar113,auVar92,0);
            bVar50 = (byte)uVar12 & bVar57;
            bVar52 = bVar57;
            if (bVar50 != 0) {
              bVar52 = bVar50;
            }
            iVar15 = 0;
            for (uVar51 = (uint)bVar52; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar52 = '\x01' << ((byte)iVar15 & 0x1f);
            fVar221 = *(float *)(local_300 + (uint)(iVar15 << 2));
            fVar222 = *(float *)(local_240 + (uint)(iVar15 << 2));
            fVar223 = local_8a4;
            if ((float)local_660._0_4_ < 0.0) {
              fVar223 = sqrtf((float)local_660._0_4_);
            }
            bVar50 = ~bVar52;
            lVar58 = 5;
            do {
              auVar130._4_4_ = fVar222;
              auVar130._0_4_ = fVar222;
              auVar130._8_4_ = fVar222;
              auVar130._12_4_ = fVar222;
              auVar68 = vfmadd132ps_fma(auVar130,ZEXT816(0) << 0x40,local_650);
              fVar236 = 1.0 - fVar221;
              auVar177._0_4_ = local_520._0_4_ * fVar221;
              auVar177._4_4_ = local_520._4_4_ * fVar221;
              auVar177._8_4_ = local_520._8_4_ * fVar221;
              auVar177._12_4_ = local_520._12_4_ * fVar221;
              local_570 = ZEXT416((uint)fVar236);
              auVar194._4_4_ = fVar236;
              auVar194._0_4_ = fVar236;
              auVar194._8_4_ = fVar236;
              auVar194._12_4_ = fVar236;
              auVar70 = vfmadd231ps_fma(auVar177,auVar194,local_4e0._0_16_);
              auVar202._0_4_ = local_500._0_4_ * fVar221;
              auVar202._4_4_ = local_500._4_4_ * fVar221;
              auVar202._8_4_ = local_500._8_4_ * fVar221;
              auVar202._12_4_ = local_500._12_4_ * fVar221;
              auVar63 = vfmadd231ps_fma(auVar202,auVar194,local_520._0_16_);
              auVar208._0_4_ = fVar221 * (float)local_540._0_4_;
              auVar208._4_4_ = fVar221 * (float)local_540._4_4_;
              auVar208._8_4_ = fVar221 * fStack_538;
              auVar208._12_4_ = fVar221 * fStack_534;
              auVar69 = vfmadd231ps_fma(auVar208,auVar194,local_500._0_16_);
              auVar218._0_4_ = fVar221 * auVar63._0_4_;
              auVar218._4_4_ = fVar221 * auVar63._4_4_;
              auVar218._8_4_ = fVar221 * auVar63._8_4_;
              auVar218._12_4_ = fVar221 * auVar63._12_4_;
              auVar70 = vfmadd231ps_fma(auVar218,auVar194,auVar70);
              auVar178._0_4_ = fVar221 * auVar69._0_4_;
              auVar178._4_4_ = fVar221 * auVar69._4_4_;
              auVar178._8_4_ = fVar221 * auVar69._8_4_;
              auVar178._12_4_ = fVar221 * auVar69._12_4_;
              auVar63 = vfmadd231ps_fma(auVar178,auVar194,auVar63);
              auVar203._0_4_ = fVar221 * auVar63._0_4_;
              auVar203._4_4_ = fVar221 * auVar63._4_4_;
              auVar203._8_4_ = fVar221 * auVar63._8_4_;
              auVar203._12_4_ = fVar221 * auVar63._12_4_;
              auVar69 = vfmadd231ps_fma(auVar203,auVar70,auVar194);
              auVar70 = vsubps_avx(auVar63,auVar70);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar63 = vmulps_avx512vl(auVar70,auVar20);
              local_4a0._0_16_ = auVar69;
              auVar70 = vsubps_avx(auVar68,auVar69);
              local_680._0_16_ = auVar70;
              auVar70 = vdpps_avx(auVar70,auVar70,0x7f);
              local_600._0_16_ = auVar70;
              local_920 = ZEXT416((uint)fVar221);
              if (auVar70._0_4_ < 0.0) {
                auVar204._0_4_ = sqrtf(auVar70._0_4_);
                auVar204._4_60_ = extraout_var_01;
                auVar70 = auVar204._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
              }
              local_580 = vdpps_avx(auVar63,auVar63,0x7f);
              fVar236 = local_580._0_4_;
              auVar179._4_12_ = ZEXT812(0) << 0x20;
              auVar179._0_4_ = fVar236;
              auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              fVar122 = auVar68._0_4_;
              local_590 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_580,auVar21);
              auVar68 = vfnmadd213ss_fma(local_590,local_580,ZEXT416(0x40000000));
              uVar51 = auVar70._0_4_;
              if (fVar236 < auVar69._0_4_) {
                auVar233._0_4_ = sqrtf(fVar236);
                auVar233._4_60_ = extraout_var_02;
                auVar70 = ZEXT416(uVar51);
                auVar69 = auVar233._0_16_;
              }
              else {
                auVar69 = vsqrtss_avx512f(local_580,local_580);
              }
              fVar236 = fVar122 * 1.5 + fVar236 * -0.5 * fVar122 * fVar122 * fVar122;
              auVar131._0_4_ = auVar63._0_4_ * fVar236;
              auVar131._4_4_ = auVar63._4_4_ * fVar236;
              auVar131._8_4_ = auVar63._8_4_ * fVar236;
              auVar131._12_4_ = auVar63._12_4_ * fVar236;
              auVar71 = vdpps_avx(local_680._0_16_,auVar131,0x7f);
              auVar72 = vaddss_avx512f(auVar70,ZEXT416(0x3f800000));
              auVar132._0_4_ = auVar71._0_4_ * auVar71._0_4_;
              auVar132._4_4_ = auVar71._4_4_ * auVar71._4_4_;
              auVar132._8_4_ = auVar71._8_4_ * auVar71._8_4_;
              auVar132._12_4_ = auVar71._12_4_ * auVar71._12_4_;
              auVar64 = vsubps_avx(local_600._0_16_,auVar132);
              fVar122 = auVar64._0_4_;
              auVar156._4_12_ = ZEXT812(0) << 0x20;
              auVar156._0_4_ = fVar122;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar156);
              auVar65 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              uVar61 = fVar122 == 0.0;
              uVar59 = fVar122 < 0.0;
              if ((bool)uVar59) {
                local_5b0 = fVar236;
                fStack_5ac = fVar236;
                fStack_5a8 = fVar236;
                fStack_5a4 = fVar236;
                local_5a0 = auVar73;
                fVar224 = sqrtf(fVar122);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar70 = ZEXT416(uVar51);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar73 = local_5a0;
                fVar236 = local_5b0;
                fVar225 = fStack_5ac;
                fVar226 = fStack_5a8;
                fVar239 = fStack_5a4;
              }
              else {
                auVar64 = vsqrtss_avx(auVar64,auVar64);
                fVar224 = auVar64._0_4_;
                fVar225 = fVar236;
                fVar226 = fVar236;
                fVar239 = fVar236;
              }
              in_ZMM31 = ZEXT1664(auVar73);
              auVar232._8_4_ = 0x7fffffff;
              auVar232._0_8_ = 0x7fffffff7fffffff;
              auVar232._12_4_ = 0x7fffffff;
              auVar248 = ZEXT3264(local_7e0);
              auVar235 = ZEXT3264(local_7c0);
              auVar253 = ZEXT3264(local_800);
              auVar252 = ZEXT3264(local_720);
              auVar251 = ZEXT3264(local_740);
              auVar244 = ZEXT3264(local_820);
              auVar245 = ZEXT3264(local_840);
              auVar246 = ZEXT3264(local_620);
              auVar247 = ZEXT3264(local_760);
              auVar249 = ZEXT3264(local_860);
              auVar250 = ZEXT3264(local_880);
              auVar254 = ZEXT3264(local_780);
              auVar255 = ZEXT3264(local_8a0);
              auVar243 = ZEXT3264(local_7a0);
              auVar64 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_570);
              fVar147 = auVar64._0_4_ * 6.0;
              fVar11 = fVar221 * 6.0;
              auVar180._0_4_ = fVar11 * (float)local_540._0_4_;
              auVar180._4_4_ = fVar11 * (float)local_540._4_4_;
              auVar180._8_4_ = fVar11 * fStack_538;
              auVar180._12_4_ = fVar11 * fStack_534;
              auVar157._4_4_ = fVar147;
              auVar157._0_4_ = fVar147;
              auVar157._8_4_ = fVar147;
              auVar157._12_4_ = fVar147;
              auVar64 = vfmadd132ps_fma(auVar157,auVar180,local_500._0_16_);
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_570,local_920);
              fVar147 = auVar75._0_4_ * 6.0;
              auVar181._4_4_ = fVar147;
              auVar181._0_4_ = fVar147;
              auVar181._8_4_ = fVar147;
              auVar181._12_4_ = fVar147;
              auVar64 = vfmadd132ps_fma(auVar181,auVar64,local_520._0_16_);
              fVar147 = local_570._0_4_ * 6.0;
              auVar158._4_4_ = fVar147;
              auVar158._0_4_ = fVar147;
              auVar158._8_4_ = fVar147;
              auVar158._12_4_ = fVar147;
              auVar64 = vfmadd132ps_fma(auVar158,auVar64,local_4e0._0_16_);
              auVar182._0_4_ = auVar64._0_4_ * (float)local_580._0_4_;
              auVar182._4_4_ = auVar64._4_4_ * (float)local_580._0_4_;
              auVar182._8_4_ = auVar64._8_4_ * (float)local_580._0_4_;
              auVar182._12_4_ = auVar64._12_4_ * (float)local_580._0_4_;
              auVar64 = vdpps_avx(auVar63,auVar64,0x7f);
              fVar147 = auVar64._0_4_;
              auVar159._0_4_ = auVar63._0_4_ * fVar147;
              auVar159._4_4_ = auVar63._4_4_ * fVar147;
              auVar159._8_4_ = auVar63._8_4_ * fVar147;
              auVar159._12_4_ = auVar63._12_4_ * fVar147;
              auVar75 = vsubps_avx(auVar182,auVar159);
              fVar147 = auVar68._0_4_ * (float)local_590._0_4_;
              auVar64 = vmaxss_avx(ZEXT416((uint)fVar211),
                                   ZEXT416((uint)(fVar222 * fVar223 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(auVar63,auVar22);
              auVar183._0_4_ = fVar236 * auVar75._0_4_ * fVar147;
              auVar183._4_4_ = fVar225 * auVar75._4_4_ * fVar147;
              auVar183._8_4_ = fVar226 * auVar75._8_4_ * fVar147;
              auVar183._12_4_ = fVar239 * auVar75._12_4_ * fVar147;
              auVar68 = vdpps_avx(auVar74,auVar131,0x7f);
              auVar75 = vdivss_avx512f(ZEXT416((uint)fVar211),auVar69);
              auVar69 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar211),auVar64);
              auVar70 = vdpps_avx(local_680._0_16_,auVar183,0x7f);
              vfmadd213ss_avx512f(auVar72,auVar75,auVar69);
              fVar236 = auVar68._0_4_ + auVar70._0_4_;
              auVar70 = vdpps_avx(local_650,auVar131,0x7f);
              auVar68 = vdpps_avx(local_680._0_16_,auVar74,0x7f);
              auVar69 = vmulss_avx512f(auVar73,ZEXT416((uint)(fVar122 * -0.5)));
              auVar73 = vmulss_avx512f(auVar73,auVar73);
              fVar122 = auVar69._0_4_ * auVar73._0_4_ + auVar65._0_4_;
              auVar69 = vdpps_avx(local_680._0_16_,local_650,0x7f);
              auVar73 = vfnmadd231ss_avx512f(auVar68,auVar71,ZEXT416((uint)fVar236));
              auVar72 = vfnmadd231ss_avx512f(auVar69,auVar71,auVar70);
              auVar68 = vpermilps_avx(local_4a0._0_16_,0xff);
              fVar224 = fVar224 - auVar68._0_4_;
              auVar68 = vshufps_avx(auVar63,auVar63,0xff);
              auVar69 = vfmsub213ss_fma(auVar73,ZEXT416((uint)fVar122),auVar68);
              fVar122 = auVar72._0_4_ * fVar122;
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar69._0_4_)),
                                        ZEXT416((uint)fVar236),ZEXT416((uint)fVar122));
              fVar225 = auVar73._0_4_;
              auVar219._0_4_ = fVar122 / fVar225;
              auVar219._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar195._0_4_ = auVar69._0_4_ / fVar225;
              auVar195._4_12_ = auVar69._4_12_;
              auVar69 = vmulss_avx512f(auVar71,auVar219);
              auVar73 = vmulss_avx512f(auVar71,auVar195);
              fVar221 = fVar221 - (auVar69._0_4_ - fVar224 * (auVar70._0_4_ / fVar225));
              fVar222 = fVar222 - (fVar224 * (fVar236 / fVar225) - auVar73._0_4_);
              auVar70 = vandps_avx512vl(auVar71,auVar232);
              auVar70 = vucomiss_avx512f(auVar70);
              bVar60 = true;
              if ((bool)uVar59 || (bool)uVar61) {
                auVar233 = ZEXT3264(local_6a0);
                auVar204 = ZEXT3264(local_640);
              }
              else {
                auVar70 = vaddss_avx512f(auVar64,auVar70);
                auVar69 = vfmadd231ss_fma(auVar70,local_5d0,ZEXT416(0x36000000));
                auVar70 = vandps_avx(auVar232,ZEXT416((uint)fVar224));
                auVar204 = ZEXT3264(local_640);
                if (auVar69._0_4_ <= auVar70._0_4_) {
                  auVar233 = ZEXT3264(local_6a0);
                }
                else {
                  fVar222 = fVar222 + (float)local_5c0._0_4_;
                  auVar233 = ZEXT3264(local_6a0);
                  if ((((fVar146 <= fVar222) &&
                       (fVar236 = *(float *)(ray + k * 4 + 0x80), fVar222 <= fVar236)) &&
                      (0.0 <= fVar221)) && (fVar221 <= 1.0)) {
                    auVar41._12_4_ = 0;
                    auVar41._0_12_ = ZEXT812(0);
                    auVar70 = vrsqrt14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)local_600._0_4_));
                    fVar122 = auVar70._0_4_;
                    pGVar2 = (context->scene->geometries).items[local_8c8].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar52 = true;
                      }
                      else {
                        fVar122 = fVar122 * 1.5 +
                                  (float)local_600._0_4_ * -0.5 * fVar122 * fVar122 * fVar122;
                        auVar160._0_4_ = local_680._0_4_ * fVar122;
                        auVar160._4_4_ = local_680._4_4_ * fVar122;
                        auVar160._8_4_ = local_680._8_4_ * fVar122;
                        auVar160._12_4_ = local_680._12_4_ * fVar122;
                        auVar69 = vfmadd213ps_fma(auVar68,auVar160,auVar63);
                        auVar70 = vshufps_avx(auVar160,auVar160,0xc9);
                        auVar68 = vshufps_avx(auVar63,auVar63,0xc9);
                        auVar161._0_4_ = auVar160._0_4_ * auVar68._0_4_;
                        auVar161._4_4_ = auVar160._4_4_ * auVar68._4_4_;
                        auVar161._8_4_ = auVar160._8_4_ * auVar68._8_4_;
                        auVar161._12_4_ = auVar160._12_4_ * auVar68._12_4_;
                        auVar63 = vfmsub231ps_fma(auVar161,auVar63,auVar70);
                        auVar70 = vshufps_avx(auVar63,auVar63,0xc9);
                        auVar68 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar63 = vshufps_avx(auVar63,auVar63,0xd2);
                        auVar133._0_4_ = auVar69._0_4_ * auVar63._0_4_;
                        auVar133._4_4_ = auVar69._4_4_ * auVar63._4_4_;
                        auVar133._8_4_ = auVar69._8_4_ * auVar63._8_4_;
                        auVar133._12_4_ = auVar69._12_4_ * auVar63._12_4_;
                        auVar70 = vfmsub231ps_fma(auVar133,auVar70,auVar68);
                        local_440 = (RTCHitN  [16])vshufps_avx(auVar70,auVar70,0x55);
                        auStack_430 = vshufps_avx(auVar70,auVar70,0xaa);
                        local_420 = auVar70._0_4_;
                        uStack_41c = local_420;
                        uStack_418 = local_420;
                        uStack_414 = local_420;
                        local_410 = fVar221;
                        fStack_40c = fVar221;
                        fStack_408 = fVar221;
                        fStack_404 = fVar221;
                        local_400 = ZEXT416(0) << 0x20;
                        local_3f0 = local_450._0_8_;
                        uStack_3e8 = local_450._8_8_;
                        local_3e0 = local_460;
                        vpcmpeqd_avx2(ZEXT1632(local_460),ZEXT1632(local_460));
                        uStack_3cc = context->user->instID[0];
                        local_3d0 = uStack_3cc;
                        uStack_3c8 = uStack_3cc;
                        uStack_3c4 = uStack_3cc;
                        uStack_3c0 = context->user->instPrimID[0];
                        uStack_3bc = uStack_3c0;
                        uStack_3b8 = uStack_3c0;
                        uStack_3b4 = uStack_3c0;
                        *(float *)(ray + k * 4 + 0x80) = fVar222;
                        local_8e0 = local_470._0_8_;
                        uStack_8d8 = local_470._8_8_;
                        local_6d0.valid = (int *)&local_8e0;
                        local_6d0.geometryUserPtr = pGVar2->userPtr;
                        local_6d0.context = context->user;
                        local_6d0.hit = local_440;
                        local_6d0.N = 4;
                        local_6d0.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar2->occlusionFilterN)(&local_6d0);
                          auVar243 = ZEXT3264(local_7a0);
                          auVar255 = ZEXT3264(local_8a0);
                          auVar254 = ZEXT3264(local_780);
                          auVar250 = ZEXT3264(local_880);
                          auVar249 = ZEXT3264(local_860);
                          auVar247 = ZEXT3264(local_760);
                          auVar246 = ZEXT3264(local_620);
                          auVar245 = ZEXT3264(local_840);
                          auVar244 = ZEXT3264(local_820);
                          auVar251 = ZEXT3264(local_740);
                          auVar204 = ZEXT3264(local_640);
                          auVar252 = ZEXT3264(local_720);
                          auVar253 = ZEXT3264(local_800);
                          auVar235 = ZEXT3264(local_7c0);
                          auVar233 = ZEXT3264(local_6a0);
                          auVar248 = ZEXT3264(local_7e0);
                        }
                        auVar44._8_8_ = uStack_8d8;
                        auVar44._0_8_ = local_8e0;
                        uVar55 = vptestmd_avx512vl(auVar44,auVar44);
                        if ((uVar55 & 0xf) == 0) {
                          bVar52 = false;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var3)(&local_6d0);
                            auVar243 = ZEXT3264(local_7a0);
                            auVar255 = ZEXT3264(local_8a0);
                            auVar254 = ZEXT3264(local_780);
                            auVar250 = ZEXT3264(local_880);
                            auVar249 = ZEXT3264(local_860);
                            auVar247 = ZEXT3264(local_760);
                            auVar246 = ZEXT3264(local_620);
                            auVar245 = ZEXT3264(local_840);
                            auVar244 = ZEXT3264(local_820);
                            auVar251 = ZEXT3264(local_740);
                            auVar204 = ZEXT3264(local_640);
                            auVar252 = ZEXT3264(local_720);
                            auVar253 = ZEXT3264(local_800);
                            auVar235 = ZEXT3264(local_7c0);
                            auVar233 = ZEXT3264(local_6a0);
                            auVar248 = ZEXT3264(local_7e0);
                          }
                          auVar45._8_8_ = uStack_8d8;
                          auVar45._0_8_ = local_8e0;
                          uVar55 = vptestmd_avx512vl(auVar45,auVar45);
                          uVar55 = uVar55 & 0xf;
                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar60 = (bool)((byte)uVar55 & 1);
                          bVar4 = (bool)((byte)(uVar55 >> 1) & 1);
                          bVar5 = (bool)((byte)(uVar55 >> 2) & 1);
                          bVar6 = SUB81(uVar55 >> 3,0);
                          *(uint *)(local_6d0.ray + 0x80) =
                               (uint)bVar60 * auVar70._0_4_ |
                               (uint)!bVar60 * *(int *)(local_6d0.ray + 0x80);
                          *(uint *)(local_6d0.ray + 0x84) =
                               (uint)bVar4 * auVar70._4_4_ |
                               (uint)!bVar4 * *(int *)(local_6d0.ray + 0x84);
                          *(uint *)(local_6d0.ray + 0x88) =
                               (uint)bVar5 * auVar70._8_4_ |
                               (uint)!bVar5 * *(int *)(local_6d0.ray + 0x88);
                          *(uint *)(local_6d0.ray + 0x8c) =
                               (uint)bVar6 * auVar70._12_4_ |
                               (uint)!bVar6 * *(int *)(local_6d0.ray + 0x8c);
                          bVar52 = (byte)uVar55 != 0;
                        }
                        if ((bool)bVar52 == false) {
                          *(float *)(ray + k * 4 + 0x80) = fVar236;
                        }
                      }
                      bVar60 = false;
                      goto LAB_01b89564;
                    }
                  }
                  bVar60 = false;
                  bVar52 = 0;
                }
              }
LAB_01b89564:
              if (!bVar60) goto LAB_01b8997d;
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
            bVar52 = 0;
LAB_01b8997d:
            bVar56 = bVar56 | bVar52 & 1;
            auVar47._4_4_ = fStack_31c;
            auVar47._0_4_ = local_320;
            auVar47._8_4_ = fStack_318;
            auVar47._12_4_ = fStack_314;
            auVar47._16_4_ = fStack_310;
            auVar47._20_4_ = fStack_30c;
            auVar47._24_4_ = fStack_308;
            auVar47._28_4_ = fStack_304;
            uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar29._4_4_ = uVar210;
            auVar29._0_4_ = uVar210;
            auVar29._8_4_ = uVar210;
            auVar29._12_4_ = uVar210;
            auVar29._16_4_ = uVar210;
            auVar29._20_4_ = uVar210;
            auVar29._24_4_ = uVar210;
            auVar29._28_4_ = uVar210;
            uVar12 = vcmpps_avx512vl(auVar47,auVar29,2);
            bVar57 = bVar50 & bVar57 & (byte)uVar12;
          } while (bVar57 != 0);
        }
        uVar13 = vpcmpd_avx512vl(local_2a0,_local_340,1);
        uVar14 = vpcmpd_avx512vl(local_2a0,local_220,1);
        auVar163._0_4_ = (float)local_360._0_4_ + (float)local_1c0._0_4_;
        auVar163._4_4_ = (float)local_360._4_4_ + (float)local_1c0._4_4_;
        auVar163._8_4_ = fStack_358 + fStack_1b8;
        auVar163._12_4_ = fStack_354 + fStack_1b4;
        auVar163._16_4_ = fStack_350 + fStack_1b0;
        auVar163._20_4_ = fStack_34c + fStack_1ac;
        auVar163._24_4_ = fStack_348 + fStack_1a8;
        auVar163._28_4_ = fStack_344 + fStack_1a4;
        uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar187._4_4_ = uVar210;
        auVar187._0_4_ = uVar210;
        auVar187._8_4_ = uVar210;
        auVar187._12_4_ = uVar210;
        auVar187._16_4_ = uVar210;
        auVar187._20_4_ = uVar210;
        auVar187._24_4_ = uVar210;
        auVar187._28_4_ = uVar210;
        uVar12 = vcmpps_avx512vl(auVar163,auVar187,2);
        bVar57 = (byte)local_8b0 & (byte)uVar14 & (byte)uVar12;
        auVar196._0_4_ = (float)local_360._0_4_ + (float)local_260._0_4_;
        auVar196._4_4_ = (float)local_360._4_4_ + (float)local_260._4_4_;
        auVar196._8_4_ = fStack_358 + fStack_258;
        auVar196._12_4_ = fStack_354 + fStack_254;
        auVar196._16_4_ = fStack_350 + fStack_250;
        auVar196._20_4_ = fStack_34c + fStack_24c;
        auVar196._24_4_ = fStack_348 + fStack_248;
        auVar196._28_4_ = fStack_344 + fStack_244;
        uVar12 = vcmpps_avx512vl(auVar196,auVar187,2);
        bVar49 = bVar49 & (byte)uVar13 & (byte)uVar12 | bVar57;
        prim = local_6e0;
        if (bVar49 == 0) {
          auVar197 = ZEXT3264(_DAT_02020f20);
          auVar188 = ZEXT3264(local_560);
          auVar145 = ZEXT1664(local_6f0);
        }
        else {
          local_180[uVar53 * 0x60] = bVar49;
          bVar60 = (bool)(bVar57 >> 1 & 1);
          bVar4 = (bool)(bVar57 >> 2 & 1);
          bVar5 = (bool)(bVar57 >> 3 & 1);
          bVar6 = (bool)(bVar57 >> 4 & 1);
          bVar7 = (bool)(bVar57 >> 5 & 1);
          bVar8 = (bool)(bVar57 >> 6 & 1);
          auStack_160[uVar53 * 0x18] =
               (uint)(bVar57 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar57 & 1) * local_260._0_4_;
          auStack_160[uVar53 * 0x18 + 1] =
               (uint)bVar60 * local_1c0._4_4_ | (uint)!bVar60 * local_260._4_4_;
          auStack_160[uVar53 * 0x18 + 2] =
               (uint)bVar4 * (int)fStack_1b8 | (uint)!bVar4 * (int)fStack_258;
          auStack_160[uVar53 * 0x18 + 3] =
               (uint)bVar5 * (int)fStack_1b4 | (uint)!bVar5 * (int)fStack_254;
          auStack_160[uVar53 * 0x18 + 4] =
               (uint)bVar6 * (int)fStack_1b0 | (uint)!bVar6 * (int)fStack_250;
          local_140[uVar53 * 0x18 + -3] =
               (float)((uint)bVar7 * (int)fStack_1ac | (uint)!bVar7 * (int)fStack_24c);
          local_140[uVar53 * 0x18 + -2] =
               (float)((uint)bVar8 * (int)fStack_1a8 | (uint)!bVar8 * (int)fStack_248);
          local_140[uVar53 * 0x18 + -1] =
               (float)((uint)(bVar57 >> 7) * (int)fStack_1a4 |
                      (uint)!(bool)(bVar57 >> 7) * (int)fStack_244);
          auVar145 = ZEXT1664(local_6f0);
          *(long *)(local_140 + uVar53 * 0x18) = local_6f0._0_8_;
          local_138[uVar53 * 0x18] = (int)local_8c0 + 1;
          auVar197 = ZEXT3264(_DAT_02020f20);
          auVar188 = ZEXT3264(local_560);
          uVar53 = (ulong)((int)uVar53 + 1);
        }
      }
    }
    do {
      if ((int)uVar53 == 0) {
        if (bVar56 != 0) {
          return bVar62;
        }
        uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = uVar210;
        auVar23._0_4_ = uVar210;
        auVar23._8_4_ = uVar210;
        auVar23._12_4_ = uVar210;
        uVar12 = vcmpps_avx512vl(local_2b0,auVar23,2);
        uVar51 = (uint)local_6d8 & (uint)uVar12;
        local_6d8 = (ulong)uVar51;
        bVar62 = uVar51 != 0;
        if (!bVar62) {
          return bVar62;
        }
        goto LAB_01b873ac;
      }
      uVar55 = (ulong)((int)uVar53 - 1);
      auVar92 = *(undefined1 (*) [32])(auStack_160 + uVar55 * 0x18);
      auVar164._0_4_ = auVar92._0_4_ + (float)local_360._0_4_;
      auVar164._4_4_ = auVar92._4_4_ + (float)local_360._4_4_;
      auVar164._8_4_ = auVar92._8_4_ + fStack_358;
      auVar164._12_4_ = auVar92._12_4_ + fStack_354;
      auVar164._16_4_ = auVar92._16_4_ + fStack_350;
      auVar164._20_4_ = auVar92._20_4_ + fStack_34c;
      auVar164._24_4_ = auVar92._24_4_ + fStack_348;
      auVar164._28_4_ = auVar92._28_4_ + fStack_344;
      uVar210 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar30._4_4_ = uVar210;
      auVar30._0_4_ = uVar210;
      auVar30._8_4_ = uVar210;
      auVar30._12_4_ = uVar210;
      auVar30._16_4_ = uVar210;
      auVar30._20_4_ = uVar210;
      auVar30._24_4_ = uVar210;
      auVar30._28_4_ = uVar210;
      uVar12 = vcmpps_avx512vl(auVar164,auVar30,2);
      uVar51 = (uint)uVar12 & (uint)local_180[uVar55 * 0x60];
      bVar49 = (byte)uVar51;
      if (uVar51 == 0) {
        auVar145 = ZEXT1664(auVar145._0_16_);
      }
      else {
        auVar165._8_4_ = 0x7f800000;
        auVar165._0_8_ = 0x7f8000007f800000;
        auVar165._12_4_ = 0x7f800000;
        auVar165._16_4_ = 0x7f800000;
        auVar165._20_4_ = 0x7f800000;
        auVar165._24_4_ = 0x7f800000;
        auVar165._28_4_ = 0x7f800000;
        auVar76 = vblendmps_avx512vl(auVar165,auVar92);
        auVar114._0_4_ =
             (uint)(bVar49 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar49 & 1) * (int)auVar92._0_4_;
        bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar60 * auVar76._4_4_ | (uint)!bVar60 * (int)auVar92._4_4_;
        bVar60 = (bool)((byte)(uVar51 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar60 * auVar76._8_4_ | (uint)!bVar60 * (int)auVar92._8_4_;
        bVar60 = (bool)((byte)(uVar51 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar60 * auVar76._12_4_ | (uint)!bVar60 * (int)auVar92._12_4_;
        bVar60 = (bool)((byte)(uVar51 >> 4) & 1);
        auVar114._16_4_ = (uint)bVar60 * auVar76._16_4_ | (uint)!bVar60 * (int)auVar92._16_4_;
        bVar60 = (bool)((byte)(uVar51 >> 5) & 1);
        auVar114._20_4_ = (uint)bVar60 * auVar76._20_4_ | (uint)!bVar60 * (int)auVar92._20_4_;
        bVar60 = (bool)((byte)(uVar51 >> 6) & 1);
        auVar114._24_4_ = (uint)bVar60 * auVar76._24_4_ | (uint)!bVar60 * (int)auVar92._24_4_;
        auVar114._28_4_ =
             (uVar51 >> 7) * auVar76._28_4_ | (uint)!SUB41(uVar51 >> 7,0) * (int)auVar92._28_4_;
        auVar92 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar92 = vminps_avx(auVar114,auVar92);
        auVar76 = vshufpd_avx(auVar92,auVar92,5);
        auVar92 = vminps_avx(auVar92,auVar76);
        auVar76 = vpermpd_avx2(auVar92,0x4e);
        auVar92 = vminps_avx(auVar92,auVar76);
        uVar12 = vcmpps_avx512vl(auVar114,auVar92,0);
        bVar57 = (byte)uVar12 & bVar49;
        if (bVar57 != 0) {
          uVar51 = (uint)bVar57;
        }
        fVar211 = local_140[uVar55 * 0x18 + 1];
        uVar115 = 0;
        for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x80000000) {
          uVar115 = uVar115 + 1;
        }
        local_8c0 = (ulong)local_138[uVar55 * 0x18];
        bVar57 = ~('\x01' << ((byte)uVar115 & 0x1f)) & bVar49;
        local_180[uVar55 * 0x60] = bVar57;
        auVar188 = ZEXT3264(local_560);
        uVar54 = uVar55;
        if (bVar57 != 0) {
          uVar54 = uVar53;
        }
        fVar221 = local_140[uVar55 * 0x18];
        auVar166._4_4_ = fVar221;
        auVar166._0_4_ = fVar221;
        auVar166._8_4_ = fVar221;
        auVar166._12_4_ = fVar221;
        auVar166._16_4_ = fVar221;
        auVar166._20_4_ = fVar221;
        auVar166._24_4_ = fVar221;
        auVar166._28_4_ = fVar221;
        fVar211 = fVar211 - fVar221;
        auVar144._4_4_ = fVar211;
        auVar144._0_4_ = fVar211;
        auVar144._8_4_ = fVar211;
        auVar144._12_4_ = fVar211;
        auVar144._16_4_ = fVar211;
        auVar144._20_4_ = fVar211;
        auVar144._24_4_ = fVar211;
        auVar144._28_4_ = fVar211;
        auVar70 = vfmadd132ps_fma(auVar144,auVar166,auVar197._0_32_);
        _local_440 = ZEXT1632(auVar70);
        auVar145 = ZEXT864(*(ulong *)(local_440 + (ulong)uVar115 * 4));
        uVar55 = uVar54;
      }
      uVar53 = uVar55;
    } while (bVar49 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }